

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [28];
  undefined1 auVar82 [28];
  uint uVar83;
  ulong uVar84;
  RTCIntersectArguments *pRVar85;
  ulong uVar86;
  long lVar87;
  ulong uVar88;
  undefined4 uVar89;
  undefined8 unaff_R13;
  long lVar90;
  ulong uVar91;
  undefined8 uVar92;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar107;
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar97 [16];
  undefined1 auVar106 [32];
  undefined8 uVar113;
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  float fVar127;
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [32];
  undefined1 auVar133 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  vint4 ai;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar180 [32];
  undefined1 auVar185 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined4 uVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar204;
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar214;
  float fVar215;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar216;
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 (*local_5e0) [16];
  Precalculations *local_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  undefined4 uStack_558;
  undefined4 uStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  LinearSpace3fa *local_4b0;
  ulong local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar184 [16];
  
  PVar10 = prim[1];
  uVar88 = (ulong)(byte)PVar10;
  fVar128 = *(float *)(prim + uVar88 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar88 * 0x19 + 6));
  auVar93._0_4_ = fVar128 * auVar14._0_4_;
  auVar93._4_4_ = fVar128 * auVar14._4_4_;
  auVar93._8_4_ = fVar128 * auVar14._8_4_;
  auVar93._12_4_ = fVar128 * auVar14._12_4_;
  auVar156._0_4_ = fVar128 * auVar15._0_4_;
  auVar156._4_4_ = fVar128 * auVar15._4_4_;
  auVar156._8_4_ = fVar128 * auVar15._8_4_;
  auVar156._12_4_ = fVar128 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xc + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xd + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x12 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x13 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar197 = ZEXT1664(auVar95);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x14 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar208._4_4_ = auVar156._0_4_;
  auVar208._0_4_ = auVar156._0_4_;
  auVar208._8_4_ = auVar156._0_4_;
  auVar208._12_4_ = auVar156._0_4_;
  auVar115 = vshufps_avx(auVar156,auVar156,0x55);
  auVar94 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar128 = auVar94._0_4_;
  auVar190._0_4_ = fVar128 * auVar16._0_4_;
  fVar127 = auVar94._4_4_;
  auVar190._4_4_ = fVar127 * auVar16._4_4_;
  fVar107 = auVar94._8_4_;
  auVar190._8_4_ = fVar107 * auVar16._8_4_;
  fVar108 = auVar94._12_4_;
  auVar190._12_4_ = fVar108 * auVar16._12_4_;
  auVar183._0_4_ = auVar19._0_4_ * fVar128;
  auVar183._4_4_ = auVar19._4_4_ * fVar127;
  auVar183._8_4_ = auVar19._8_4_ * fVar107;
  auVar183._12_4_ = auVar19._12_4_ * fVar108;
  auVar176._0_4_ = auVar129._0_4_ * fVar128;
  auVar176._4_4_ = auVar129._4_4_ * fVar127;
  auVar176._8_4_ = auVar129._8_4_ * fVar107;
  auVar176._12_4_ = auVar129._12_4_ * fVar108;
  auVar94 = vfmadd231ps_fma(auVar190,auVar115,auVar15);
  auVar130 = vfmadd231ps_fma(auVar183,auVar115,auVar18);
  auVar115 = vfmadd231ps_fma(auVar176,auVar95,auVar115);
  auVar144 = vfmadd231ps_fma(auVar94,auVar208,auVar14);
  auVar130 = vfmadd231ps_fma(auVar130,auVar208,auVar17);
  auVar149 = vfmadd231ps_fma(auVar115,auVar96,auVar208);
  auVar209._4_4_ = auVar93._0_4_;
  auVar209._0_4_ = auVar93._0_4_;
  auVar209._8_4_ = auVar93._0_4_;
  auVar209._12_4_ = auVar93._0_4_;
  auVar115 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar128 = auVar94._0_4_;
  auVar157._0_4_ = fVar128 * auVar16._0_4_;
  fVar127 = auVar94._4_4_;
  auVar157._4_4_ = fVar127 * auVar16._4_4_;
  fVar107 = auVar94._8_4_;
  auVar157._8_4_ = fVar107 * auVar16._8_4_;
  fVar108 = auVar94._12_4_;
  auVar157._12_4_ = fVar108 * auVar16._12_4_;
  auVar114._0_4_ = auVar19._0_4_ * fVar128;
  auVar114._4_4_ = auVar19._4_4_ * fVar127;
  auVar114._8_4_ = auVar19._8_4_ * fVar107;
  auVar114._12_4_ = auVar19._12_4_ * fVar108;
  auVar94._0_4_ = auVar129._0_4_ * fVar128;
  auVar94._4_4_ = auVar129._4_4_ * fVar127;
  auVar94._8_4_ = auVar129._8_4_ * fVar107;
  auVar94._12_4_ = auVar129._12_4_ * fVar108;
  auVar15 = vfmadd231ps_fma(auVar157,auVar115,auVar15);
  auVar16 = vfmadd231ps_fma(auVar114,auVar115,auVar18);
  auVar18 = vfmadd231ps_fma(auVar94,auVar115,auVar95);
  auVar19 = vfmadd231ps_fma(auVar15,auVar209,auVar14);
  auVar95 = vfmadd231ps_fma(auVar16,auVar209,auVar17);
  auVar129 = vfmadd231ps_fma(auVar18,auVar209,auVar96);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar144,local_2d0);
  auVar148._8_4_ = 0x219392ef;
  auVar148._0_8_ = 0x219392ef219392ef;
  auVar148._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar148,1);
  auVar15 = vblendvps_avx(auVar144,auVar148,auVar14);
  auVar14 = vandps_avx(auVar130,local_2d0);
  auVar14 = vcmpps_avx(auVar14,auVar148,1);
  auVar16 = vblendvps_avx(auVar130,auVar148,auVar14);
  auVar14 = vandps_avx(local_2d0,auVar149);
  auVar14 = vcmpps_avx(auVar14,auVar148,1);
  auVar14 = vblendvps_avx(auVar149,auVar148,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar177);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar177);
  auVar18 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar16 = vfnmadd213ps_fma(auVar14,auVar15,auVar177);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar88 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar96 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar149._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar149._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar149._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar149._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar88 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vsubps_avx(auVar14,auVar19);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar88 * 0xe + 6);
  auVar14 = vpmovsxwd_avx(auVar16);
  auVar158._0_4_ = auVar17._0_4_ * auVar15._0_4_;
  auVar158._4_4_ = auVar17._4_4_ * auVar15._4_4_;
  auVar158._8_4_ = auVar17._8_4_ * auVar15._8_4_;
  auVar158._12_4_ = auVar17._12_4_ * auVar15._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar95);
  auVar166._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar166._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar166._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar166._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar10;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar95);
  auVar115._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar115._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar115._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar115._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar88 * 0x15 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vsubps_avx(auVar14,auVar129);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar88 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar144._0_4_ = auVar96._0_4_ * auVar15._0_4_;
  auVar144._4_4_ = auVar96._4_4_ * auVar15._4_4_;
  auVar144._8_4_ = auVar96._8_4_ * auVar15._8_4_;
  auVar144._12_4_ = auVar96._12_4_ * auVar15._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar129);
  auVar95._0_4_ = auVar96._0_4_ * auVar14._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar14._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar14._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar149,auVar158);
  auVar15 = vpminsd_avx(auVar166,auVar115);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar144,auVar95);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar184._4_4_ = uVar89;
  auVar184._0_4_ = uVar89;
  auVar184._8_4_ = uVar89;
  auVar184._12_4_ = uVar89;
  auVar189 = ZEXT1664(auVar184);
  auVar15 = vmaxps_avx(auVar15,auVar184);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_2e0._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar149,auVar158);
  auVar15 = vpmaxsd_avx(auVar166,auVar115);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar144,auVar95);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar129._4_4_ = uVar89;
  auVar129._0_4_ = uVar89;
  auVar129._8_4_ = uVar89;
  auVar129._12_4_ = uVar89;
  auVar15 = vminps_avx(auVar15,auVar129);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar130[4] = PVar10;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar10;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar10;
  auVar130._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar130,_DAT_01f4ad30);
  auVar96._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar14 = vcmpps_avx(local_2e0,auVar96,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar89 = vmovmskps_avx(auVar14);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  local_4b0 = pre->ray_space + k;
  local_5e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_4a8 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar89);
  local_5d8 = pre;
  while (local_4a8 != 0) {
    local_720 = auVar189._0_32_;
    local_6c0 = auVar197._0_32_;
    lVar90 = 0;
    for (uVar88 = local_4a8; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
      lVar90 = lVar90 + 1;
    }
    local_500._4_4_ = *(undefined4 *)(prim + 2);
    local_728 = (ulong)(uint)local_500._4_4_;
    uVar83 = *(uint *)(prim + lVar90 * 4 + 6);
    pGVar12 = (context->scene->geometries).items[local_728].ptr;
    uVar88 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                             pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar83);
    p_Var13 = pGVar12[1].intersectionFilterN;
    lVar90 = *(long *)&pGVar12[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar90 + (long)p_Var13 * uVar88);
    local_650 = *(undefined8 *)*pauVar1;
    uStack_648 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar90 + (uVar88 + 1) * (long)p_Var13);
    local_660 = *(undefined8 *)*pauVar2;
    uStack_658 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar90 + (uVar88 + 2) * (long)p_Var13);
    local_670 = *(undefined8 *)*pauVar3;
    uStack_668 = *(undefined8 *)(*pauVar3 + 8);
    uVar91 = local_4a8 - 1 & local_4a8;
    pauVar4 = (undefined1 (*) [12])(lVar90 + (uVar88 + 3) * (long)p_Var13);
    local_550 = (float)*(undefined8 *)*pauVar4;
    fStack_54c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_548 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_544 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    uVar88 = uVar91 - 1;
    if (uVar91 != 0) {
      uVar88 = uVar88 & uVar91;
      for (uVar84 = uVar91; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
      uVar84 = uVar88;
      if (uVar88 != 0) {
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar17 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar15 = vsubps_avx(*pauVar1,auVar17);
    uVar89 = auVar15._0_4_;
    auVar150._4_4_ = uVar89;
    auVar150._0_4_ = uVar89;
    auVar150._8_4_ = uVar89;
    auVar150._12_4_ = uVar89;
    auVar14 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    aVar8 = (local_4b0->vx).field_0;
    aVar9 = (local_4b0->vy).field_0;
    fVar128 = (local_4b0->vz).field_0.m128[0];
    fVar127 = (local_4b0->vz).field_0.m128[1];
    fVar107 = (local_4b0->vz).field_0.m128[2];
    fVar108 = (local_4b0->vz).field_0.m128[3];
    auVar167._0_4_ = fVar128 * auVar15._0_4_;
    auVar167._4_4_ = fVar127 * auVar15._4_4_;
    auVar167._8_4_ = fVar107 * auVar15._8_4_;
    auVar167._12_4_ = fVar108 * auVar15._12_4_;
    auVar14 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar9,auVar14);
    auVar19 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar8,auVar150);
    auVar14 = vblendps_avx(auVar19,*pauVar1,8);
    auVar16 = vsubps_avx(*pauVar2,auVar17);
    uVar89 = auVar16._0_4_;
    auVar168._4_4_ = uVar89;
    auVar168._0_4_ = uVar89;
    auVar168._8_4_ = uVar89;
    auVar168._12_4_ = uVar89;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar191._0_4_ = fVar128 * auVar16._0_4_;
    auVar191._4_4_ = fVar127 * auVar16._4_4_;
    auVar191._8_4_ = fVar107 * auVar16._8_4_;
    auVar191._12_4_ = fVar108 * auVar16._12_4_;
    auVar15 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar9,auVar15);
    auVar96 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar8,auVar168);
    auVar15 = vblendps_avx(auVar96,*pauVar2,8);
    auVar18 = vsubps_avx(*pauVar3,auVar17);
    uVar89 = auVar18._0_4_;
    auVar178._4_4_ = uVar89;
    auVar178._0_4_ = uVar89;
    auVar178._8_4_ = uVar89;
    auVar178._12_4_ = uVar89;
    auVar16 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar196._0_4_ = fVar128 * auVar18._0_4_;
    auVar196._4_4_ = fVar127 * auVar18._4_4_;
    auVar196._8_4_ = fVar107 * auVar18._8_4_;
    auVar196._12_4_ = fVar108 * auVar18._12_4_;
    auVar16 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar9,auVar16);
    auVar95 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar178);
    auVar16 = vblendps_avx(auVar95,*pauVar3,8);
    auVar78._12_4_ = fStack_544;
    auVar78._0_12_ = *pauVar4;
    auVar18 = vsubps_avx(auVar78,auVar17);
    uVar89 = auVar18._0_4_;
    auVar179._4_4_ = uVar89;
    auVar179._0_4_ = uVar89;
    auVar179._8_4_ = uVar89;
    auVar179._12_4_ = uVar89;
    auVar17 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar199._0_4_ = fVar128 * auVar18._0_4_;
    auVar199._4_4_ = fVar127 * auVar18._4_4_;
    auVar199._8_4_ = fVar107 * auVar18._8_4_;
    auVar199._12_4_ = fVar108 * auVar18._12_4_;
    auVar17 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar9,auVar17);
    auVar129 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar179);
    auVar17 = vblendps_avx(auVar129,auVar78,8);
    auVar14 = vandps_avx(auVar14,local_2d0);
    auVar15 = vandps_avx(auVar15,local_2d0);
    auVar18 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vandps_avx(auVar16,local_2d0);
    auVar15 = vandps_avx(auVar17,local_2d0);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar18,auVar14);
    auVar15 = vmovshdup_avx(auVar14);
    auVar15 = vmaxss_avx(auVar15,auVar14);
    auVar14 = vshufpd_avx(auVar14,auVar14,1);
    auVar14 = vmaxss_avx(auVar14,auVar15);
    lVar90 = (long)iVar11 * 0x44;
    auVar15 = vmovshdup_avx(auVar19);
    uVar92 = auVar15._0_8_;
    local_460._8_8_ = uVar92;
    local_460._0_8_ = uVar92;
    local_460._16_8_ = uVar92;
    local_460._24_8_ = uVar92;
    auVar155 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x484);
    auVar15 = vmovshdup_avx(auVar96);
    uVar92 = auVar15._0_8_;
    local_6a0._8_8_ = uVar92;
    local_6a0._0_8_ = uVar92;
    local_6a0._16_8_ = uVar92;
    local_6a0._24_8_ = uVar92;
    auVar170 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x908);
    uVar195 = auVar95._0_4_;
    auVar137._4_4_ = uVar195;
    auVar137._0_4_ = uVar195;
    auVar137._8_4_ = uVar195;
    auVar137._12_4_ = uVar195;
    auVar137._16_4_ = uVar195;
    auVar137._20_4_ = uVar195;
    auVar137._24_4_ = uVar195;
    auVar137._28_4_ = uVar195;
    auVar15 = vmovshdup_avx(auVar95);
    uVar92 = auVar15._0_8_;
    local_620._8_8_ = uVar92;
    local_620._0_8_ = uVar92;
    local_620._16_8_ = uVar92;
    local_620._24_8_ = uVar92;
    fVar127 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar90 + 0xd8c);
    fVar107 = *(float *)(bezier_basis0 + lVar90 + 0xd90);
    fVar108 = *(float *)(bezier_basis0 + lVar90 + 0xd94);
    fVar109 = *(float *)(bezier_basis0 + lVar90 + 0xd98);
    fVar110 = *(float *)(bezier_basis0 + lVar90 + 0xd9c);
    fVar111 = *(float *)(bezier_basis0 + lVar90 + 0xda0);
    fVar112 = *(float *)(bezier_basis0 + lVar90 + 0xda4);
    auVar81 = *(undefined1 (*) [28])(bezier_basis0 + lVar90 + 0xd8c);
    local_640 = auVar129._0_4_;
    auVar15 = vmovshdup_avx(auVar129);
    uVar92 = auVar15._0_8_;
    auVar141._0_4_ = fVar127 * local_640;
    auVar141._4_4_ = fVar107 * local_640;
    auVar141._8_4_ = fVar108 * local_640;
    auVar141._12_4_ = fVar109 * local_640;
    auVar141._16_4_ = fVar110 * local_640;
    auVar141._20_4_ = fVar111 * local_640;
    auVar141._24_4_ = fVar112 * local_640;
    auVar141._28_4_ = 0;
    fVar205 = auVar15._0_4_;
    auVar98._0_4_ = fVar205 * fVar127;
    fVar206 = auVar15._4_4_;
    auVar98._4_4_ = fVar206 * fVar107;
    auVar98._8_4_ = fVar205 * fVar108;
    auVar98._12_4_ = fVar206 * fVar109;
    auVar98._16_4_ = fVar205 * fVar110;
    auVar98._20_4_ = fVar206 * fVar111;
    auVar98._24_4_ = fVar205 * fVar112;
    auVar98._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar141,auVar170,auVar137);
    auVar16 = vfmadd231ps_fma(auVar98,auVar170,local_620);
    uVar89 = auVar96._0_4_;
    local_700._4_4_ = uVar89;
    local_700._0_4_ = uVar89;
    local_700._8_4_ = uVar89;
    local_700._12_4_ = uVar89;
    local_700._16_4_ = uVar89;
    local_700._20_4_ = uVar89;
    local_700._24_4_ = uVar89;
    local_700._28_4_ = uVar89;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar155,local_700);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar155,local_6a0);
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar90);
    uVar89 = auVar19._0_4_;
    auVar210._4_4_ = uVar89;
    auVar210._0_4_ = uVar89;
    auVar210._8_4_ = uVar89;
    auVar210._12_4_ = uVar89;
    auVar210._16_4_ = uVar89;
    auVar210._20_4_ = uVar89;
    auVar210._24_4_ = uVar89;
    auVar210._28_4_ = uVar89;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar98,auVar210);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar98,local_460);
    auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x908);
    fVar198 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar90 + 0xd8c);
    fVar204 = *(float *)(bezier_basis1 + lVar90 + 0xd90);
    fVar67 = *(float *)(bezier_basis1 + lVar90 + 0xd94);
    fVar68 = *(float *)(bezier_basis1 + lVar90 + 0xd98);
    fVar69 = *(float *)(bezier_basis1 + lVar90 + 0xd9c);
    fVar70 = *(float *)(bezier_basis1 + lVar90 + 0xda0);
    fVar71 = *(float *)(bezier_basis1 + lVar90 + 0xda4);
    auVar82 = *(undefined1 (*) [28])(bezier_basis1 + lVar90 + 0xd8c);
    auVar105._4_4_ = local_640 * fVar204;
    auVar105._0_4_ = local_640 * fVar198;
    auVar105._8_4_ = local_640 * fVar67;
    auVar105._12_4_ = local_640 * fVar68;
    auVar105._16_4_ = local_640 * fVar69;
    auVar105._20_4_ = local_640 * fVar70;
    auVar105._24_4_ = local_640 * fVar71;
    auVar105._28_4_ = local_640;
    auVar17 = vfmadd231ps_fma(auVar105,auVar141,auVar137);
    auVar123._4_4_ = fVar206 * fVar204;
    auVar123._0_4_ = fVar205 * fVar198;
    auVar123._8_4_ = fVar205 * fVar67;
    auVar123._12_4_ = fVar206 * fVar68;
    auVar123._16_4_ = fVar205 * fVar69;
    auVar123._20_4_ = fVar206 * fVar70;
    auVar123._24_4_ = fVar205 * fVar71;
    auVar123._28_4_ = uVar195;
    auVar18 = vfmadd231ps_fma(auVar123,auVar141,local_620);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x484);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar105,local_700);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar105,local_6a0);
    auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar90);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar123,auVar210);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar123,local_460);
    auVar118 = ZEXT1632(auVar17);
    local_300 = ZEXT1632(auVar15);
    auVar20 = vsubps_avx(auVar118,local_300);
    _local_420 = ZEXT1632(auVar18);
    auVar99 = ZEXT1632(auVar16);
    auVar106 = vsubps_avx(_local_420,auVar99);
    auVar100._0_4_ = auVar20._0_4_ * auVar16._0_4_;
    auVar100._4_4_ = auVar20._4_4_ * auVar16._4_4_;
    auVar100._8_4_ = auVar20._8_4_ * auVar16._8_4_;
    auVar100._12_4_ = auVar20._12_4_ * auVar16._12_4_;
    auVar100._16_4_ = auVar20._16_4_ * 0.0;
    auVar100._20_4_ = auVar20._20_4_ * 0.0;
    auVar100._24_4_ = auVar20._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    fVar207 = auVar106._0_4_;
    auVar119._0_4_ = fVar207 * auVar15._0_4_;
    fVar214 = auVar106._4_4_;
    auVar119._4_4_ = fVar214 * auVar15._4_4_;
    fVar215 = auVar106._8_4_;
    auVar119._8_4_ = fVar215 * auVar15._8_4_;
    fVar216 = auVar106._12_4_;
    auVar119._12_4_ = fVar216 * auVar15._12_4_;
    fVar217 = auVar106._16_4_;
    auVar119._16_4_ = fVar217 * 0.0;
    fVar218 = auVar106._20_4_;
    auVar119._20_4_ = fVar218 * 0.0;
    fVar219 = auVar106._24_4_;
    auVar119._24_4_ = fVar219 * 0.0;
    auVar119._28_4_ = 0;
    auVar100 = vsubps_avx(auVar100,auVar119);
    auVar15 = vpermilps_avx(*pauVar1,0xff);
    uVar113 = auVar15._0_8_;
    local_80._8_8_ = uVar113;
    local_80._0_8_ = uVar113;
    local_80._16_8_ = uVar113;
    local_80._24_8_ = uVar113;
    auVar16 = vpermilps_avx(*pauVar2,0xff);
    uVar113 = auVar16._0_8_;
    local_a0._8_8_ = uVar113;
    local_a0._0_8_ = uVar113;
    local_a0._16_8_ = uVar113;
    local_a0._24_8_ = uVar113;
    auVar16 = vpermilps_avx(*pauVar3,0xff);
    uVar113 = auVar16._0_8_;
    local_c0._8_8_ = uVar113;
    local_c0._0_8_ = uVar113;
    local_c0._16_8_ = uVar113;
    local_c0._24_8_ = uVar113;
    auVar79._12_4_ = fStack_544;
    auVar79._0_12_ = *pauVar4;
    auVar16 = vpermilps_avx(auVar79,0xff);
    local_e0 = auVar16._0_8_;
    fVar128 = auVar16._0_4_;
    auVar169._0_4_ = fVar127 * fVar128;
    fVar127 = auVar16._4_4_;
    auVar169._4_4_ = fVar107 * fVar127;
    auVar169._8_4_ = fVar108 * fVar128;
    auVar169._12_4_ = fVar109 * fVar127;
    auVar169._16_4_ = fVar110 * fVar128;
    auVar169._20_4_ = fVar111 * fVar127;
    auVar169._24_4_ = fVar112 * fVar128;
    auVar169._28_4_ = 0;
    auVar16 = vfmadd231ps_fma(auVar169,local_c0,auVar170);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_a0,auVar155);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar98,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar162._4_4_ = fVar127 * fVar204;
    auVar162._0_4_ = fVar128 * fVar198;
    auVar162._8_4_ = fVar128 * fVar67;
    auVar162._12_4_ = fVar127 * fVar68;
    auVar162._16_4_ = fVar128 * fVar69;
    auVar162._20_4_ = fVar127 * fVar70;
    auVar162._24_4_ = fVar128 * fVar71;
    auVar162._28_4_ = auVar98._28_4_;
    auVar17 = vfmadd231ps_fma(auVar162,auVar141,local_c0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar105,local_a0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar123,local_80);
    auVar21._4_4_ = fVar214 * fVar214;
    auVar21._0_4_ = fVar207 * fVar207;
    auVar21._8_4_ = fVar215 * fVar215;
    auVar21._12_4_ = fVar216 * fVar216;
    auVar21._16_4_ = fVar217 * fVar217;
    auVar21._20_4_ = fVar218 * fVar218;
    auVar21._24_4_ = fVar219 * fVar219;
    auVar21._28_4_ = auVar15._4_4_;
    auVar15 = vfmadd231ps_fma(auVar21,auVar20,auVar20);
    auVar162 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar140._4_4_ = auVar162._4_4_ * auVar162._4_4_ * auVar15._4_4_;
    auVar140._0_4_ = auVar162._0_4_ * auVar162._0_4_ * auVar15._0_4_;
    auVar140._8_4_ = auVar162._8_4_ * auVar162._8_4_ * auVar15._8_4_;
    auVar140._12_4_ = auVar162._12_4_ * auVar162._12_4_ * auVar15._12_4_;
    auVar140._16_4_ = auVar162._16_4_ * auVar162._16_4_ * 0.0;
    auVar140._20_4_ = auVar162._20_4_ * auVar162._20_4_ * 0.0;
    auVar140._24_4_ = auVar162._24_4_ * auVar162._24_4_ * 0.0;
    auVar140._28_4_ = auVar162._28_4_;
    auVar185._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar185._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar185._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar185._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar185._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar185._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar185._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar185._28_4_ = auVar100._28_4_;
    auVar162 = vcmpps_avx(auVar185,auVar140,2);
    fVar128 = auVar14._0_4_ * 4.7683716e-07;
    auVar101._0_4_ = (float)iVar11;
    register0x000014c4 = auVar95._4_12_;
    auVar101._4_4_ = auVar101._0_4_;
    auVar101._8_4_ = auVar101._0_4_;
    auVar101._12_4_ = auVar101._0_4_;
    auVar101._16_4_ = auVar101._0_4_;
    auVar101._20_4_ = auVar101._0_4_;
    auVar101._24_4_ = auVar101._0_4_;
    auVar101._28_4_ = auVar101._0_4_;
    auVar100 = vcmpps_avx(_DAT_01f7b060,auVar101,1);
    auVar14 = vpermilps_avx(auVar19,0xaa);
    uVar113 = auVar14._0_8_;
    local_4e0._8_8_ = uVar113;
    local_4e0._0_8_ = uVar113;
    local_4e0._16_8_ = uVar113;
    local_4e0._24_8_ = uVar113;
    auVar15 = vpermilps_avx(auVar96,0xaa);
    uVar113 = auVar15._0_8_;
    auVar153._8_8_ = uVar113;
    auVar153._0_8_ = uVar113;
    auVar153._16_8_ = uVar113;
    auVar153._24_8_ = uVar113;
    auVar14 = vshufps_avx(auVar95,auVar95,0xaa);
    uVar113 = auVar14._0_8_;
    local_280._8_8_ = uVar113;
    local_280._0_8_ = uVar113;
    local_280._16_8_ = uVar113;
    local_280._24_8_ = uVar113;
    auVar14 = vshufps_avx(auVar129,auVar129,0xaa);
    uVar113 = auVar14._0_8_;
    register0x00001508 = uVar113;
    local_540 = uVar113;
    register0x00001510 = uVar113;
    register0x00001518 = uVar113;
    auVar202 = ZEXT3264(_local_540);
    auVar21 = auVar100 & auVar162;
    uVar7 = *(uint *)(ray + k * 4 + 0x30);
    local_5a0._0_16_ = ZEXT416(uVar7);
    local_570 = ZEXT416(uVar83);
    fStack_63c = local_640;
    fStack_638 = local_640;
    fStack_634 = local_640;
    fStack_630 = local_640;
    fStack_62c = local_640;
    fStack_628 = local_640;
    fStack_624 = local_640;
    local_560._0_4_ = auVar101._0_4_;
    local_570._0_4_ = uVar83;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0x7f,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0xbf,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f]) {
      uVar88 = 0;
      auVar197 = ZEXT3264(local_6c0);
      auVar189 = ZEXT3264(local_720);
      auVar126 = ZEXT3264(local_6a0);
      auVar147 = ZEXT3264(local_620);
      auVar181 = ZEXT3264(CONCAT428(local_640,
                                    CONCAT424(local_640,
                                              CONCAT420(local_640,
                                                        CONCAT416(local_640,
                                                                  CONCAT412(local_640,
                                                                            CONCAT48(local_640,
                                                                                     CONCAT44(
                                                  local_640,local_640))))))));
      auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(fVar205,
                                                  CONCAT412(fVar206,CONCAT48(fVar205,uVar92)))))));
      auVar213 = ZEXT3264(local_700);
    }
    else {
      _local_320 = vandps_avx(auVar162,auVar100);
      local_440._0_4_ = auVar82._0_4_;
      local_440._4_4_ = auVar82._4_4_;
      fStack_438 = auVar82._8_4_;
      fStack_434 = auVar82._12_4_;
      fStack_430 = auVar82._16_4_;
      fStack_42c = auVar82._20_4_;
      fStack_428 = auVar82._24_4_;
      fVar198 = auVar14._0_4_;
      fVar204 = auVar14._4_4_;
      auVar180._4_4_ = fVar204 * (float)local_440._4_4_;
      auVar180._0_4_ = fVar198 * (float)local_440._0_4_;
      auVar180._8_4_ = fVar198 * fStack_438;
      auVar180._12_4_ = fVar204 * fStack_434;
      auVar180._16_4_ = fVar198 * fStack_430;
      auVar180._20_4_ = fVar204 * fStack_42c;
      auVar180._24_4_ = fVar198 * fStack_428;
      auVar180._28_4_ = local_320._28_4_;
      auVar14 = vfmadd213ps_fma(auVar141,local_280,auVar180);
      auVar14 = vfmadd213ps_fma(auVar105,auVar153,ZEXT1632(auVar14));
      auVar14 = vfmadd213ps_fma(auVar123,local_4e0,ZEXT1632(auVar14));
      _local_440 = ZEXT1632(auVar14);
      local_480._0_4_ = auVar81._0_4_;
      local_480._4_4_ = auVar81._4_4_;
      fStack_478 = auVar81._8_4_;
      fStack_474 = auVar81._12_4_;
      fStack_470 = auVar81._16_4_;
      fStack_46c = auVar81._20_4_;
      fStack_468 = auVar81._24_4_;
      auVar22._4_4_ = fVar204 * (float)local_480._4_4_;
      auVar22._0_4_ = fVar198 * (float)local_480._0_4_;
      auVar22._8_4_ = fVar198 * fStack_478;
      auVar22._12_4_ = fVar204 * fStack_474;
      auVar22._16_4_ = fVar198 * fStack_470;
      auVar22._20_4_ = fVar204 * fStack_46c;
      auVar22._24_4_ = fVar198 * fStack_468;
      auVar22._28_4_ = local_320._28_4_;
      auVar14 = vfmadd213ps_fma(auVar170,local_280,auVar22);
      auVar14 = vfmadd213ps_fma(auVar155,auVar153,ZEXT1632(auVar14));
      auVar155 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1210);
      auVar170 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1694);
      auVar141 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1b18);
      fVar127 = *(float *)(bezier_basis0 + lVar90 + 0x1f9c);
      fVar107 = *(float *)(bezier_basis0 + lVar90 + 0x1fa0);
      fVar108 = *(float *)(bezier_basis0 + lVar90 + 0x1fa4);
      fVar109 = *(float *)(bezier_basis0 + lVar90 + 0x1fa8);
      fVar110 = *(float *)(bezier_basis0 + lVar90 + 0x1fac);
      fVar111 = *(float *)(bezier_basis0 + lVar90 + 0x1fb0);
      fVar112 = *(float *)(bezier_basis0 + lVar90 + 0x1fb4);
      auVar161._0_4_ = local_640 * fVar127;
      auVar161._4_4_ = local_640 * fVar107;
      auVar161._8_4_ = local_640 * fVar108;
      auVar161._12_4_ = local_640 * fVar109;
      auVar161._16_4_ = local_640 * fVar110;
      auVar161._20_4_ = local_640 * fVar111;
      auVar161._24_4_ = local_640 * fVar112;
      auVar161._28_4_ = 0;
      auVar23._4_4_ = fVar107 * fVar206;
      auVar23._0_4_ = fVar127 * fVar205;
      auVar23._8_4_ = fVar108 * fVar205;
      auVar23._12_4_ = fVar109 * fVar206;
      auVar23._16_4_ = fVar110 * fVar205;
      auVar23._20_4_ = fVar111 * fVar206;
      auVar23._24_4_ = fVar112 * fVar205;
      auVar23._28_4_ = auVar15._4_4_;
      auVar192._0_4_ = fVar198 * fVar127;
      auVar192._4_4_ = fVar204 * fVar107;
      auVar192._8_4_ = fVar198 * fVar108;
      auVar192._12_4_ = fVar204 * fVar109;
      auVar192._16_4_ = fVar198 * fVar110;
      auVar192._20_4_ = fVar204 * fVar111;
      auVar192._24_4_ = fVar198 * fVar112;
      auVar192._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar161,auVar141,auVar137);
      auVar18 = vfmadd231ps_fma(auVar23,auVar141,local_620);
      auVar19 = vfmadd231ps_fma(auVar192,local_280,auVar141);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar170,local_700);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar170,local_6a0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar170,auVar153);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar155,auVar210);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar155,local_460);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar155,local_4e0);
      fVar127 = *(float *)(bezier_basis1 + lVar90 + 0x1f9c);
      fVar107 = *(float *)(bezier_basis1 + lVar90 + 0x1fa0);
      fVar108 = *(float *)(bezier_basis1 + lVar90 + 0x1fa4);
      fVar109 = *(float *)(bezier_basis1 + lVar90 + 0x1fa8);
      fVar110 = *(float *)(bezier_basis1 + lVar90 + 0x1fac);
      fVar111 = *(float *)(bezier_basis1 + lVar90 + 0x1fb0);
      fVar112 = *(float *)(bezier_basis1 + lVar90 + 0x1fb4);
      auVar170._4_4_ = local_640 * fVar107;
      auVar170._0_4_ = local_640 * fVar127;
      auVar170._8_4_ = local_640 * fVar108;
      auVar170._12_4_ = local_640 * fVar109;
      auVar170._16_4_ = local_640 * fVar110;
      auVar170._20_4_ = local_640 * fVar111;
      auVar170._24_4_ = local_640 * fVar112;
      auVar170._28_4_ = local_640;
      auVar24._4_4_ = fVar206 * fVar107;
      auVar24._0_4_ = fVar205 * fVar127;
      auVar24._8_4_ = fVar205 * fVar108;
      auVar24._12_4_ = fVar206 * fVar109;
      auVar24._16_4_ = fVar205 * fVar110;
      auVar24._20_4_ = fVar206 * fVar111;
      auVar24._24_4_ = fVar205 * fVar112;
      auVar24._28_4_ = fVar204;
      auVar25._4_4_ = fVar204 * fVar107;
      auVar25._0_4_ = fVar198 * fVar127;
      auVar25._8_4_ = fVar198 * fVar108;
      auVar25._12_4_ = fVar204 * fVar109;
      auVar25._16_4_ = fVar198 * fVar110;
      auVar25._20_4_ = fVar204 * fVar111;
      auVar25._24_4_ = fVar198 * fVar112;
      auVar25._28_4_ = *(undefined4 *)(bezier_basis0 + lVar90 + 0x1fb8);
      auVar155 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1b18);
      auVar96 = vfmadd231ps_fma(auVar170,auVar155,auVar137);
      auVar95 = vfmadd231ps_fma(auVar24,auVar155,local_620);
      auVar129 = vfmadd231ps_fma(auVar25,auVar155,local_280);
      auVar155 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1694);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar155,local_700);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar155,local_6a0);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar153,auVar155);
      auVar155 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1210);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar155,auVar210);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar155,local_460);
      auVar120._8_4_ = 0x7fffffff;
      auVar120._0_8_ = 0x7fffffff7fffffff;
      auVar120._12_4_ = 0x7fffffff;
      auVar120._16_4_ = 0x7fffffff;
      auVar120._20_4_ = 0x7fffffff;
      auVar120._24_4_ = 0x7fffffff;
      auVar120._28_4_ = 0x7fffffff;
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_4e0,auVar155);
      auVar155 = vandps_avx(ZEXT1632(auVar15),auVar120);
      auVar170 = vandps_avx(ZEXT1632(auVar18),auVar120);
      auVar170 = vmaxps_avx(auVar155,auVar170);
      auVar155 = vandps_avx(ZEXT1632(auVar19),auVar120);
      auVar155 = vmaxps_avx(auVar170,auVar155);
      auVar138._4_4_ = fVar128;
      auVar138._0_4_ = fVar128;
      auVar138._8_4_ = fVar128;
      auVar138._12_4_ = fVar128;
      auVar138._16_4_ = fVar128;
      auVar138._20_4_ = fVar128;
      auVar138._24_4_ = fVar128;
      auVar138._28_4_ = fVar128;
      auVar155 = vcmpps_avx(auVar155,auVar138,1);
      auVar141 = vblendvps_avx(ZEXT1632(auVar15),auVar20,auVar155);
      auVar105 = vblendvps_avx(ZEXT1632(auVar18),auVar106,auVar155);
      auVar155 = vandps_avx(ZEXT1632(auVar96),auVar120);
      auVar170 = vandps_avx(ZEXT1632(auVar95),auVar120);
      auVar123 = vmaxps_avx(auVar155,auVar170);
      auVar155 = vandps_avx(ZEXT1632(auVar129),auVar120);
      auVar155 = vmaxps_avx(auVar123,auVar155);
      auVar162 = vcmpps_avx(auVar155,auVar138,1);
      auVar155 = vblendvps_avx(ZEXT1632(auVar96),auVar20,auVar162);
      auVar123 = vblendvps_avx(ZEXT1632(auVar95),auVar106,auVar162);
      auVar14 = vfmadd213ps_fma(auVar98,local_4e0,ZEXT1632(auVar14));
      auVar15 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar105,auVar105);
      auVar98 = vrsqrtps_avx(ZEXT1632(auVar15));
      fVar127 = auVar98._0_4_;
      fVar107 = auVar98._4_4_;
      fVar108 = auVar98._8_4_;
      fVar109 = auVar98._12_4_;
      fVar110 = auVar98._16_4_;
      fVar111 = auVar98._20_4_;
      fVar112 = auVar98._24_4_;
      auVar20._4_4_ = fVar107 * fVar107 * fVar107 * auVar15._4_4_ * -0.5;
      auVar20._0_4_ = fVar127 * fVar127 * fVar127 * auVar15._0_4_ * -0.5;
      auVar20._8_4_ = fVar108 * fVar108 * fVar108 * auVar15._8_4_ * -0.5;
      auVar20._12_4_ = fVar109 * fVar109 * fVar109 * auVar15._12_4_ * -0.5;
      auVar20._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar20._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar20._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar20._28_4_ = auVar170._28_4_;
      auVar211._8_4_ = 0x3fc00000;
      auVar211._0_8_ = 0x3fc000003fc00000;
      auVar211._12_4_ = 0x3fc00000;
      auVar211._16_4_ = 0x3fc00000;
      auVar211._20_4_ = 0x3fc00000;
      auVar211._24_4_ = 0x3fc00000;
      auVar211._28_4_ = 0x3fc00000;
      auVar15 = vfmadd231ps_fma(auVar20,auVar211,auVar98);
      fVar127 = auVar15._0_4_;
      fVar107 = auVar15._4_4_;
      auVar26._4_4_ = fVar107 * auVar105._4_4_;
      auVar26._0_4_ = fVar127 * auVar105._0_4_;
      fVar108 = auVar15._8_4_;
      auVar26._8_4_ = fVar108 * auVar105._8_4_;
      fVar109 = auVar15._12_4_;
      auVar26._12_4_ = fVar109 * auVar105._12_4_;
      auVar26._16_4_ = auVar105._16_4_ * 0.0;
      auVar26._20_4_ = auVar105._20_4_ * 0.0;
      auVar26._24_4_ = auVar105._24_4_ * 0.0;
      auVar26._28_4_ = 0;
      auVar27._4_4_ = fVar107 * -auVar141._4_4_;
      auVar27._0_4_ = fVar127 * -auVar141._0_4_;
      auVar27._8_4_ = fVar108 * -auVar141._8_4_;
      auVar27._12_4_ = fVar109 * -auVar141._12_4_;
      auVar27._16_4_ = -auVar141._16_4_ * 0.0;
      auVar27._20_4_ = -auVar141._20_4_ * 0.0;
      auVar27._24_4_ = -auVar141._24_4_ * 0.0;
      auVar27._28_4_ = auVar98._28_4_;
      auVar15 = vfmadd213ps_fma(auVar155,auVar155,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar123,auVar123);
      auVar170 = vrsqrtps_avx(ZEXT1632(auVar15));
      auVar28._28_4_ = auVar162._28_4_;
      auVar28._0_28_ =
           ZEXT1628(CONCAT412(fVar109 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar127 * 0.0))));
      fVar127 = auVar170._0_4_;
      fVar107 = auVar170._4_4_;
      fVar108 = auVar170._8_4_;
      fVar109 = auVar170._12_4_;
      fVar110 = auVar170._16_4_;
      fVar111 = auVar170._20_4_;
      fVar112 = auVar170._24_4_;
      auVar29._4_4_ = fVar107 * fVar107 * fVar107 * auVar15._4_4_ * -0.5;
      auVar29._0_4_ = fVar127 * fVar127 * fVar127 * auVar15._0_4_ * -0.5;
      auVar29._8_4_ = fVar108 * fVar108 * fVar108 * auVar15._8_4_ * -0.5;
      auVar29._12_4_ = fVar109 * fVar109 * fVar109 * auVar15._12_4_ * -0.5;
      auVar29._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar29._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar29._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar29._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar29,auVar211,auVar170);
      fVar127 = auVar15._0_4_;
      auVar193._0_4_ = auVar123._0_4_ * fVar127;
      fVar107 = auVar15._4_4_;
      auVar193._4_4_ = auVar123._4_4_ * fVar107;
      fVar108 = auVar15._8_4_;
      auVar193._8_4_ = auVar123._8_4_ * fVar108;
      fVar109 = auVar15._12_4_;
      auVar193._12_4_ = auVar123._12_4_ * fVar109;
      auVar193._16_4_ = auVar123._16_4_ * 0.0;
      auVar193._20_4_ = auVar123._20_4_ * 0.0;
      auVar193._24_4_ = auVar123._24_4_ * 0.0;
      auVar193._28_4_ = 0;
      auVar30._4_4_ = -auVar155._4_4_ * fVar107;
      auVar30._0_4_ = -auVar155._0_4_ * fVar127;
      auVar30._8_4_ = -auVar155._8_4_ * fVar108;
      auVar30._12_4_ = -auVar155._12_4_ * fVar109;
      auVar30._16_4_ = -auVar155._16_4_ * 0.0;
      auVar30._20_4_ = -auVar155._20_4_ * 0.0;
      auVar30._24_4_ = -auVar155._24_4_ * 0.0;
      auVar30._28_4_ = auVar123._28_4_;
      auVar155._28_4_ = auVar170._28_4_;
      auVar155._0_28_ =
           ZEXT1628(CONCAT412(fVar109 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar127 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar16),local_300);
      auVar170 = ZEXT1632(auVar16);
      auVar18 = vfmadd213ps_fma(auVar27,auVar170,auVar99);
      auVar19 = vfmadd213ps_fma(auVar28,auVar170,ZEXT1632(auVar14));
      auVar129 = vfnmadd213ps_fma(auVar26,auVar170,local_300);
      auVar96 = vfmadd213ps_fma(auVar193,ZEXT1632(auVar17),auVar118);
      auVar115 = vfnmadd213ps_fma(auVar27,auVar170,auVar99);
      auVar180 = ZEXT1632(auVar17);
      auVar17 = vfmadd213ps_fma(auVar30,auVar180,_local_420);
      local_6e0 = ZEXT1632(auVar16);
      auVar144 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_6e0,auVar28);
      auVar16 = vfmadd213ps_fma(auVar155,auVar180,_local_440);
      auVar94 = vfnmadd213ps_fma(auVar193,auVar180,auVar118);
      auVar130 = vfnmadd213ps_fma(auVar30,auVar180,_local_420);
      auVar149 = vfnmadd231ps_fma(_local_440,auVar180,auVar155);
      auVar155 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar115));
      auVar170 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar144));
      auVar99._4_4_ = auVar144._4_4_ * auVar155._4_4_;
      auVar99._0_4_ = auVar144._0_4_ * auVar155._0_4_;
      auVar99._8_4_ = auVar144._8_4_ * auVar155._8_4_;
      auVar99._12_4_ = auVar144._12_4_ * auVar155._12_4_;
      auVar99._16_4_ = auVar155._16_4_ * 0.0;
      auVar99._20_4_ = auVar155._20_4_ * 0.0;
      auVar99._24_4_ = auVar155._24_4_ * 0.0;
      auVar99._28_4_ = 0;
      auVar95 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar115),auVar170);
      auVar118._4_4_ = auVar170._4_4_ * auVar129._4_4_;
      auVar118._0_4_ = auVar170._0_4_ * auVar129._0_4_;
      auVar118._8_4_ = auVar170._8_4_ * auVar129._8_4_;
      auVar118._12_4_ = auVar170._12_4_ * auVar129._12_4_;
      auVar118._16_4_ = auVar170._16_4_ * 0.0;
      auVar118._20_4_ = auVar170._20_4_ * 0.0;
      auVar118._24_4_ = auVar170._24_4_ * 0.0;
      auVar118._28_4_ = auVar170._28_4_;
      auVar170 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar129));
      auVar14 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar144),auVar170);
      auVar31._4_4_ = auVar115._4_4_ * auVar170._4_4_;
      auVar31._0_4_ = auVar115._0_4_ * auVar170._0_4_;
      auVar31._8_4_ = auVar115._8_4_ * auVar170._8_4_;
      auVar31._12_4_ = auVar115._12_4_ * auVar170._12_4_;
      auVar31._16_4_ = auVar170._16_4_ * 0.0;
      auVar31._20_4_ = auVar170._20_4_ * 0.0;
      auVar31._24_4_ = auVar170._24_4_ * 0.0;
      auVar31._28_4_ = auVar170._28_4_;
      auVar162 = ZEXT1632(auVar129);
      auVar129 = vfmsub231ps_fma(auVar31,auVar162,auVar155);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar95));
      auVar21 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
      auVar155 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar15),auVar21);
      auVar170 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar18),auVar21);
      auVar98 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar19),auVar21);
      auVar141 = vblendvps_avx(auVar162,ZEXT1632(auVar96),auVar21);
      auVar105 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar17),auVar21);
      auVar123 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar16),auVar21);
      auVar162 = vblendvps_avx(ZEXT1632(auVar96),auVar162,auVar21);
      auVar100 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar115),auVar21);
      auVar14 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      auVar20 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar144),auVar21);
      auVar140 = vsubps_avx(auVar162,auVar155);
      auVar185 = vsubps_avx(auVar100,auVar170);
      auVar99 = vsubps_avx(auVar20,auVar98);
      auVar118 = vsubps_avx(auVar155,auVar141);
      auVar119 = vsubps_avx(auVar170,auVar105);
      auVar169 = vsubps_avx(auVar98,auVar123);
      auVar32._4_4_ = auVar99._4_4_ * auVar155._4_4_;
      auVar32._0_4_ = auVar99._0_4_ * auVar155._0_4_;
      auVar32._8_4_ = auVar99._8_4_ * auVar155._8_4_;
      auVar32._12_4_ = auVar99._12_4_ * auVar155._12_4_;
      auVar32._16_4_ = auVar99._16_4_ * auVar155._16_4_;
      auVar32._20_4_ = auVar99._20_4_ * auVar155._20_4_;
      auVar32._24_4_ = auVar99._24_4_ * auVar155._24_4_;
      auVar32._28_4_ = auVar20._28_4_;
      auVar15 = vfmsub231ps_fma(auVar32,auVar98,auVar140);
      auVar33._4_4_ = auVar140._4_4_ * auVar170._4_4_;
      auVar33._0_4_ = auVar140._0_4_ * auVar170._0_4_;
      auVar33._8_4_ = auVar140._8_4_ * auVar170._8_4_;
      auVar33._12_4_ = auVar140._12_4_ * auVar170._12_4_;
      auVar33._16_4_ = auVar140._16_4_ * auVar170._16_4_;
      auVar33._20_4_ = auVar140._20_4_ * auVar170._20_4_;
      auVar33._24_4_ = auVar140._24_4_ * auVar170._24_4_;
      auVar33._28_4_ = auVar162._28_4_;
      auVar16 = vfmsub231ps_fma(auVar33,auVar155,auVar185);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar102._0_4_ = auVar185._0_4_ * auVar98._0_4_;
      auVar102._4_4_ = auVar185._4_4_ * auVar98._4_4_;
      auVar102._8_4_ = auVar185._8_4_ * auVar98._8_4_;
      auVar102._12_4_ = auVar185._12_4_ * auVar98._12_4_;
      auVar102._16_4_ = auVar185._16_4_ * auVar98._16_4_;
      auVar102._20_4_ = auVar185._20_4_ * auVar98._20_4_;
      auVar102._24_4_ = auVar185._24_4_ * auVar98._24_4_;
      auVar102._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar102,auVar170,auVar99);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar103._0_4_ = auVar169._0_4_ * auVar141._0_4_;
      auVar103._4_4_ = auVar169._4_4_ * auVar141._4_4_;
      auVar103._8_4_ = auVar169._8_4_ * auVar141._8_4_;
      auVar103._12_4_ = auVar169._12_4_ * auVar141._12_4_;
      auVar103._16_4_ = auVar169._16_4_ * auVar141._16_4_;
      auVar103._20_4_ = auVar169._20_4_ * auVar141._20_4_;
      auVar103._24_4_ = auVar169._24_4_ * auVar141._24_4_;
      auVar103._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar103,auVar118,auVar123);
      auVar34._4_4_ = auVar119._4_4_ * auVar123._4_4_;
      auVar34._0_4_ = auVar119._0_4_ * auVar123._0_4_;
      auVar34._8_4_ = auVar119._8_4_ * auVar123._8_4_;
      auVar34._12_4_ = auVar119._12_4_ * auVar123._12_4_;
      auVar34._16_4_ = auVar119._16_4_ * auVar123._16_4_;
      auVar34._20_4_ = auVar119._20_4_ * auVar123._20_4_;
      auVar34._24_4_ = auVar119._24_4_ * auVar123._24_4_;
      auVar34._28_4_ = auVar123._28_4_;
      auVar17 = vfmsub231ps_fma(auVar34,auVar105,auVar169);
      auVar35._4_4_ = auVar118._4_4_ * auVar105._4_4_;
      auVar35._0_4_ = auVar118._0_4_ * auVar105._0_4_;
      auVar35._8_4_ = auVar118._8_4_ * auVar105._8_4_;
      auVar35._12_4_ = auVar118._12_4_ * auVar105._12_4_;
      auVar35._16_4_ = auVar118._16_4_ * auVar105._16_4_;
      auVar35._20_4_ = auVar118._20_4_ * auVar105._20_4_;
      auVar35._24_4_ = auVar118._24_4_ * auVar105._24_4_;
      auVar35._28_4_ = auVar100._28_4_;
      auVar18 = vfmsub231ps_fma(auVar35,auVar119,auVar141);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar141 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
      auVar141 = vcmpps_avx(auVar141,ZEXT832(0) << 0x20,2);
      auVar15 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
      auVar14 = vpand_avx(auVar15,auVar14);
      auVar141 = vpmovsxwd_avx2(auVar14);
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0x7f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0xbf,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar141[0x1f]) {
LAB_011a5dff:
        auVar197 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
      }
      else {
        auVar36._4_4_ = auVar185._4_4_ * auVar169._4_4_;
        auVar36._0_4_ = auVar185._0_4_ * auVar169._0_4_;
        auVar36._8_4_ = auVar185._8_4_ * auVar169._8_4_;
        auVar36._12_4_ = auVar185._12_4_ * auVar169._12_4_;
        auVar36._16_4_ = auVar185._16_4_ * auVar169._16_4_;
        auVar36._20_4_ = auVar185._20_4_ * auVar169._20_4_;
        auVar36._24_4_ = auVar185._24_4_ * auVar169._24_4_;
        auVar36._28_4_ = auVar141._28_4_;
        auVar96 = vfmsub231ps_fma(auVar36,auVar119,auVar99);
        auVar121._0_4_ = auVar99._0_4_ * auVar118._0_4_;
        auVar121._4_4_ = auVar99._4_4_ * auVar118._4_4_;
        auVar121._8_4_ = auVar99._8_4_ * auVar118._8_4_;
        auVar121._12_4_ = auVar99._12_4_ * auVar118._12_4_;
        auVar121._16_4_ = auVar99._16_4_ * auVar118._16_4_;
        auVar121._20_4_ = auVar99._20_4_ * auVar118._20_4_;
        auVar121._24_4_ = auVar99._24_4_ * auVar118._24_4_;
        auVar121._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar121,auVar140,auVar169);
        auVar37._4_4_ = auVar140._4_4_ * auVar119._4_4_;
        auVar37._0_4_ = auVar140._0_4_ * auVar119._0_4_;
        auVar37._8_4_ = auVar140._8_4_ * auVar119._8_4_;
        auVar37._12_4_ = auVar140._12_4_ * auVar119._12_4_;
        auVar37._16_4_ = auVar140._16_4_ * auVar119._16_4_;
        auVar37._20_4_ = auVar140._20_4_ * auVar119._20_4_;
        auVar37._24_4_ = auVar140._24_4_ * auVar119._24_4_;
        auVar37._28_4_ = auVar105._28_4_;
        auVar95 = vfmsub231ps_fma(auVar37,auVar118,auVar185);
        auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar19),ZEXT1632(auVar95));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar96),_DAT_01f7b000);
        auVar141 = vrcpps_avx(ZEXT1632(auVar18));
        auVar194._8_4_ = 0x3f800000;
        auVar194._0_8_ = 0x3f8000003f800000;
        auVar194._12_4_ = 0x3f800000;
        auVar194._16_4_ = 0x3f800000;
        auVar194._20_4_ = 0x3f800000;
        auVar194._24_4_ = 0x3f800000;
        auVar194._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar141,ZEXT1632(auVar18),auVar194);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar141,auVar141);
        auVar171._0_4_ = auVar95._0_4_ * auVar98._0_4_;
        auVar171._4_4_ = auVar95._4_4_ * auVar98._4_4_;
        auVar171._8_4_ = auVar95._8_4_ * auVar98._8_4_;
        auVar171._12_4_ = auVar95._12_4_ * auVar98._12_4_;
        auVar171._16_4_ = auVar98._16_4_ * 0.0;
        auVar171._20_4_ = auVar98._20_4_ * 0.0;
        auVar171._24_4_ = auVar98._24_4_ * 0.0;
        auVar171._28_4_ = 0;
        auVar19 = vfmadd231ps_fma(auVar171,auVar170,ZEXT1632(auVar19));
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar96),auVar155);
        fVar127 = auVar15._0_4_;
        fVar107 = auVar15._4_4_;
        fVar108 = auVar15._8_4_;
        fVar109 = auVar15._12_4_;
        auVar141 = ZEXT1632(CONCAT412(fVar109 * auVar19._12_4_,
                                      CONCAT48(fVar108 * auVar19._8_4_,
                                               CONCAT44(fVar107 * auVar19._4_4_,
                                                        fVar127 * auVar19._0_4_))));
        auVar104._4_4_ = uVar7;
        auVar104._0_4_ = uVar7;
        auVar104._8_4_ = uVar7;
        auVar104._12_4_ = uVar7;
        auVar104._16_4_ = uVar7;
        auVar104._20_4_ = uVar7;
        auVar104._24_4_ = uVar7;
        auVar104._28_4_ = uVar7;
        uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = uVar89;
        auVar122._0_4_ = uVar89;
        auVar122._8_4_ = uVar89;
        auVar122._12_4_ = uVar89;
        auVar122._16_4_ = uVar89;
        auVar122._20_4_ = uVar89;
        auVar122._24_4_ = uVar89;
        auVar122._28_4_ = uVar89;
        auVar155 = vcmpps_avx(auVar104,auVar141,2);
        auVar170 = vcmpps_avx(auVar141,auVar122,2);
        auVar155 = vandps_avx(auVar170,auVar155);
        auVar15 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auVar14 = vpand_avx(auVar14,auVar15);
        auVar155 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar155 >> 0x7f,0) == '\0') &&
              (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar155 >> 0xbf,0) == '\0') &&
            (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar155[0x1f]) goto LAB_011a5dff;
        auVar155 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
        auVar15 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auVar14 = vpand_avx(auVar14,auVar15);
        auVar155 = vpmovsxwd_avx2(auVar14);
        auVar197 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0x7f,0) != '\0') ||
              (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar155 >> 0xbf,0) != '\0') ||
            (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar155[0x1f] < '\0') {
          auVar105 = ZEXT1632(CONCAT412(fVar109 * auVar16._12_4_,
                                        CONCAT48(fVar108 * auVar16._8_4_,
                                                 CONCAT44(fVar107 * auVar16._4_4_,
                                                          fVar127 * auVar16._0_4_))));
          auVar123 = ZEXT1632(CONCAT412(fVar109 * auVar17._12_4_,
                                        CONCAT48(fVar108 * auVar17._8_4_,
                                                 CONCAT44(fVar107 * auVar17._4_4_,
                                                          fVar127 * auVar17._0_4_))));
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = 0x3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar154._16_4_ = 0x3f800000;
          auVar154._20_4_ = 0x3f800000;
          auVar154._24_4_ = 0x3f800000;
          auVar154._28_4_ = 0x3f800000;
          auVar170 = vsubps_avx(auVar154,auVar105);
          _local_2a0 = vblendvps_avx(auVar170,auVar105,auVar21);
          auVar170 = vsubps_avx(auVar154,auVar123);
          local_340 = vblendvps_avx(auVar170,auVar123,auVar21);
          auVar197 = ZEXT3264(auVar155);
          local_2c0 = auVar141;
        }
      }
      auVar202 = ZEXT3264(_local_540);
      auVar189 = ZEXT3264(local_720);
      auVar155 = auVar197._0_32_;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar155 >> 0x7f,0) == '\0') &&
            (auVar197 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar155 >> 0xbf,0) == '\0') &&
          (auVar197 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar197[0x1f]) {
        uVar88 = 0;
        auVar126 = ZEXT3264(local_6a0);
        auVar147 = ZEXT3264(local_620);
        auVar181 = ZEXT3264(CONCAT428(local_640,
                                      CONCAT424(local_640,
                                                CONCAT420(local_640,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(local_640,
                                                                              CONCAT48(local_640,
                                                                                       CONCAT44(
                                                  local_640,local_640))))))));
        auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(fVar205,
                                                  CONCAT412(fVar206,CONCAT48(fVar205,uVar92)))))));
        auVar213 = ZEXT3264(local_700);
        auVar197 = ZEXT3264(local_6c0);
      }
      else {
        auVar170 = vsubps_avx(auVar180,local_6e0);
        auVar14 = vfmadd213ps_fma(auVar170,_local_2a0,local_6e0);
        fVar127 = *(float *)((long)local_5d8->ray_space + k * 4 + -0x10);
        auVar38._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar127;
        auVar38._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar127;
        auVar38._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar127;
        auVar38._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar127;
        auVar38._16_4_ = fVar127 * 0.0;
        auVar38._20_4_ = fVar127 * 0.0;
        auVar38._24_4_ = fVar127 * 0.0;
        auVar38._28_4_ = 0;
        auVar170 = vcmpps_avx(local_2c0,auVar38,6);
        auVar141 = auVar155 & auVar170;
        auVar181 = ZEXT3264(CONCAT428(local_640,
                                      CONCAT424(local_640,
                                                CONCAT420(local_640,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(local_640,
                                                                              CONCAT48(local_640,
                                                                                       CONCAT44(
                                                  local_640,local_640))))))));
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0x7f,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0xbf,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar141[0x1f]) {
          uVar88 = 0;
          auVar126 = ZEXT3264(local_6a0);
          auVar147 = ZEXT3264(local_620);
          auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
          auVar213 = ZEXT3264(local_700);
          auVar197 = ZEXT3264(local_6c0);
        }
        else {
          auVar124._8_4_ = 0xbf800000;
          auVar124._0_8_ = 0xbf800000bf800000;
          auVar124._12_4_ = 0xbf800000;
          auVar124._16_4_ = 0xbf800000;
          auVar124._20_4_ = 0xbf800000;
          auVar124._24_4_ = 0xbf800000;
          auVar124._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar14 = vfmadd213ps_fma(local_340,auVar139,auVar124);
          local_260 = _local_2a0;
          local_240 = ZEXT1632(auVar14);
          local_220 = local_2c0;
          local_200 = 0;
          local_340 = local_240;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar88 = 0;
            auVar147 = ZEXT3264(local_620);
            auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
            auVar213 = ZEXT3264(local_700);
            auVar197 = ZEXT3264(local_6c0);
          }
          else {
            auVar147 = ZEXT3264(local_620);
            auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
            auVar213 = ZEXT3264(local_700);
            auVar197 = ZEXT3264(local_6c0);
            auVar126 = ZEXT3264(auVar153);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar88 = CONCAT71((int7)(uVar88 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar155 = vandps_avx(auVar170,auVar155);
              fVar127 = 1.0 / auVar101._0_4_;
              local_180[0] = fVar127 * ((float)local_2a0._0_4_ + 0.0);
              local_180[1] = fVar127 * ((float)local_2a0._4_4_ + 1.0);
              local_180[2] = fVar127 * (fStack_298 + 2.0);
              local_180[3] = fVar127 * (fStack_294 + 3.0);
              fStack_170 = fVar127 * (fStack_290 + 4.0);
              fStack_16c = fVar127 * (fStack_28c + 5.0);
              fStack_168 = fVar127 * (fStack_288 + 6.0);
              fStack_164 = fStack_284 + 7.0;
              local_340._0_8_ = auVar14._0_8_;
              local_340._8_8_ = auVar14._8_8_;
              local_160 = local_340._0_8_;
              uStack_158 = local_340._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_2c0;
              uVar89 = vmovmskps_avx(auVar155);
              uVar84 = 0;
              uVar86 = CONCAT44((int)(uVar88 >> 0x20),uVar89);
              for (uVar88 = uVar86; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
                uVar84 = uVar84 + 1;
              }
              local_500._0_4_ = local_500._4_4_;
              local_500._8_4_ = local_500._4_4_;
              local_500._16_16_ = auVar98._16_16_;
              local_500._12_4_ = local_500._4_4_;
              local_520._0_8_ = CONCAT44(uVar83,uVar83);
              local_520 = ZEXT1632(CONCAT412(uVar83,CONCAT48(uVar83,local_520._0_8_)));
              local_600 = auVar153;
              _local_480 = auVar106;
              local_1fc = iVar11;
              local_1f0 = local_650;
              uStack_1e8 = uStack_648;
              local_1e0 = local_660;
              uStack_1d8 = uStack_658;
              local_1d0 = local_670;
              uStack_1c8 = uStack_668;
              while (auVar153 = auVar126._0_32_, uVar86 != 0) {
                uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_3c0 = local_180[uVar84];
                local_3b0 = *(undefined4 *)((long)&local_160 + uVar84 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar84 * 4);
                fVar108 = 1.0 - local_3c0;
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                          ZEXT416((uint)(local_3c0 * fVar108)),ZEXT416(0xc0000000));
                auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar108)),
                                          ZEXT416((uint)(local_3c0 * local_3c0)),ZEXT416(0x40000000)
                                         );
                fVar127 = auVar14._0_4_ * 3.0;
                fVar107 = local_3c0 * local_3c0 * 3.0;
                auVar159._0_4_ = fVar107 * local_550;
                auVar159._4_4_ = fVar107 * fStack_54c;
                auVar159._8_4_ = fVar107 * fStack_548;
                auVar159._12_4_ = fVar107 * fStack_544;
                auVar131._4_4_ = fVar127;
                auVar131._0_4_ = fVar127;
                auVar131._8_4_ = fVar127;
                auVar131._12_4_ = fVar127;
                auVar72._8_8_ = uStack_668;
                auVar72._0_8_ = local_670;
                auVar14 = vfmadd132ps_fma(auVar131,auVar159,auVar72);
                fVar127 = auVar15._0_4_ * 3.0;
                auVar151._4_4_ = fVar127;
                auVar151._0_4_ = fVar127;
                auVar151._8_4_ = fVar127;
                auVar151._12_4_ = fVar127;
                auVar74._8_8_ = uStack_658;
                auVar74._0_8_ = local_660;
                auVar14 = vfmadd132ps_fma(auVar151,auVar14,auVar74);
                fVar127 = fVar108 * fVar108 * -3.0;
                local_5d0.context = context->user;
                auVar132._4_4_ = fVar127;
                auVar132._0_4_ = fVar127;
                auVar132._8_4_ = fVar127;
                auVar132._12_4_ = fVar127;
                auVar76._8_8_ = uStack_648;
                auVar76._0_8_ = local_650;
                auVar14 = vfmadd132ps_fma(auVar132,auVar14,auVar76);
                local_3f0 = auVar14._0_4_;
                local_3e0 = vshufps_avx(auVar14,auVar14,0x55);
                local_3d0 = vshufps_avx(auVar14,auVar14,0xaa);
                local_3a0 = local_520._0_8_;
                uStack_398 = local_520._8_8_;
                local_390 = local_500._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_500._0_16_),ZEXT1632(local_500._0_16_));
                uStack_37c = (local_5d0.context)->instID[0];
                local_380 = uStack_37c;
                uStack_378 = uStack_37c;
                uStack_374 = uStack_37c;
                uStack_370 = (local_5d0.context)->instPrimID[0];
                uStack_36c = uStack_370;
                uStack_368 = uStack_370;
                uStack_364 = uStack_370;
                local_740 = *local_5e0;
                local_5d0.valid = (int *)local_740;
                local_5d0.geometryUserPtr = pGVar12->userPtr;
                local_5d0.hit = (RTCHitN *)&local_3f0;
                local_5d0.N = 4;
                local_6e0._0_4_ = uVar89;
                local_5d0.ray = (RTCRayN *)ray;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                fStack_3bc = local_3c0;
                fStack_3b8 = local_3c0;
                fStack_3b4 = local_3c0;
                uStack_3ac = local_3b0;
                uStack_3a8 = local_3b0;
                uStack_3a4 = local_3b0;
                if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->occlusionFilterN)(&local_5d0);
                  auVar202 = ZEXT3264(_local_540);
                  auVar126 = ZEXT3264(local_600);
                  auVar213 = ZEXT3264(local_700);
                  auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar189 = ZEXT3264(local_720);
                  auVar197 = ZEXT3264(local_6c0);
                  uVar89 = local_6e0._0_4_;
                }
                if (local_740 == (undefined1  [16])0x0) {
                  auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar14 = auVar14 ^ _DAT_01f46b70;
                  auVar147 = ZEXT3264(local_620);
                  auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,
                                                  CONCAT416(fVar205,CONCAT412(fVar206,CONCAT48(
                                                  fVar205,uVar92)))))));
                }
                else {
                  p_Var13 = context->args->filter;
                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                    auVar147 = ZEXT3264(local_620);
                    auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,
                                                  CONCAT416(fVar205,CONCAT412(fVar206,CONCAT48(
                                                  fVar205,uVar92)))))));
                  }
                  else {
                    auVar147 = ZEXT3264(local_620);
                    auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,
                                                  CONCAT416(fVar205,CONCAT412(fVar206,CONCAT48(
                                                  fVar205,uVar92)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var13)(&local_5d0);
                      auVar202 = ZEXT3264(_local_540);
                      auVar126 = ZEXT3264(local_600);
                      auVar213 = ZEXT3264(local_700);
                      auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,
                                                  CONCAT416(fVar205,CONCAT412(fVar206,CONCAT48(
                                                  fVar205,uVar92)))))));
                      auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                                    CONCAT424(fStack_628,
                                                              CONCAT420(fStack_62c,
                                                                        CONCAT416(fStack_630,
                                                                                  CONCAT412(
                                                  fStack_634,
                                                  CONCAT48(fStack_638,CONCAT44(fStack_63c,local_640)
                                                          )))))));
                      auVar147 = ZEXT3264(local_620);
                      auVar189 = ZEXT3264(local_720);
                      auVar197 = ZEXT3264(local_6c0);
                      uVar89 = local_6e0._0_4_;
                    }
                  }
                  auVar15 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                  auVar14 = auVar15 ^ _DAT_01f46b70;
                  auVar133._8_4_ = 0xff800000;
                  auVar133._0_8_ = 0xff800000ff800000;
                  auVar133._12_4_ = 0xff800000;
                  auVar15 = vblendvps_avx(auVar133,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                          auVar15);
                  *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar15;
                }
                auVar153 = auVar126._0_32_;
                auVar116._8_8_ = 0x100000001;
                auVar116._0_8_ = 0x100000001;
                if ((auVar116 & auVar14) != (undefined1  [16])0x0) {
                  uVar88 = CONCAT71((int7)(uVar86 >> 8),1);
                  goto LAB_011a4ff7;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar89;
                uVar88 = uVar84 & 0x3f;
                uVar84 = 0;
                uVar86 = uVar86 ^ 1L << uVar88;
                for (uVar88 = uVar86; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000)
                {
                  uVar84 = uVar84 + 1;
                }
              }
              uVar88 = 0;
            }
          }
LAB_011a4ff7:
          auVar126 = ZEXT3264(local_6a0);
        }
      }
    }
    auVar143 = ZEXT464((uint)fVar128);
    if (8 < iVar11) {
      local_300._4_4_ = iVar11;
      local_300._0_4_ = iVar11;
      local_300._8_4_ = iVar11;
      local_300._12_4_ = iVar11;
      local_300._16_4_ = iVar11;
      local_300._20_4_ = iVar11;
      local_300._24_4_ = iVar11;
      local_300._28_4_ = iVar11;
      local_320._4_4_ = fVar128;
      local_320._0_4_ = fVar128;
      fStack_318 = fVar128;
      fStack_314 = fVar128;
      fStack_310 = fVar128;
      fStack_30c = fVar128;
      fStack_308 = fVar128;
      fStack_304 = fVar128;
      local_100 = local_5a0._0_4_;
      uStack_fc = local_5a0._0_4_;
      uStack_f8 = local_5a0._0_4_;
      uStack_f4 = local_5a0._0_4_;
      uStack_f0 = local_5a0._0_4_;
      uStack_ec = local_5a0._0_4_;
      uStack_e8 = local_5a0._0_4_;
      uStack_e4 = local_5a0._0_4_;
      local_120 = 1.0 / (float)local_560._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_560._4_4_ = (undefined4)local_728;
      local_560._0_4_ = (undefined4)local_728;
      uStack_558 = (undefined4)local_728;
      uStack_554 = (undefined4)local_728;
      local_570._4_4_ = local_570._0_4_;
      local_570._8_4_ = local_570._0_4_;
      local_570._12_4_ = local_570._0_4_;
      _local_540 = auVar202._0_32_;
      local_600 = auVar153;
      for (lVar87 = 8; lVar87 < iVar11; lVar87 = lVar87 + 8) {
        auVar185 = auVar189._0_32_;
        auVar155 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar90);
        auVar170 = *(undefined1 (*) [32])(lVar90 + 0x21fb768 + lVar87 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar90 + 0x21fbbec + lVar87 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar90 + 0x21fc070 + lVar87 * 4);
        fVar112 = *(float *)*pauVar5;
        fVar198 = *(float *)(*pauVar5 + 4);
        fVar204 = *(float *)(*pauVar5 + 8);
        fVar67 = *(float *)(*pauVar5 + 0xc);
        fVar68 = *(float *)(*pauVar5 + 0x10);
        fVar69 = *(float *)(*pauVar5 + 0x14);
        fVar70 = *(float *)(*pauVar5 + 0x18);
        auVar81 = *pauVar5;
        auVar203._0_4_ = fVar112 * auVar181._0_4_;
        auVar203._4_4_ = fVar198 * auVar181._4_4_;
        auVar203._8_4_ = fVar204 * auVar181._8_4_;
        auVar203._12_4_ = fVar67 * auVar181._12_4_;
        auVar203._16_4_ = fVar68 * auVar181._16_4_;
        auVar203._20_4_ = fVar69 * auVar181._20_4_;
        auVar203._28_36_ = auVar202._28_36_;
        auVar203._24_4_ = fVar70 * auVar181._24_4_;
        auVar202._0_4_ = fVar112 * auVar175._0_4_;
        auVar202._4_4_ = fVar198 * auVar175._4_4_;
        auVar202._8_4_ = fVar204 * auVar175._8_4_;
        auVar202._12_4_ = fVar67 * auVar175._12_4_;
        auVar202._16_4_ = fVar68 * auVar175._16_4_;
        auVar202._20_4_ = fVar69 * auVar175._20_4_;
        auVar202._28_36_ = auVar143._28_36_;
        auVar202._24_4_ = fVar70 * auVar175._24_4_;
        auVar14 = vfmadd231ps_fma(auVar203._0_32_,auVar98,auVar137);
        auVar15 = vfmadd231ps_fma(auVar202._0_32_,auVar98,auVar147._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar170,auVar213._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar170,auVar126._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar155,auVar210);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar155,local_460);
        auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar90);
        auVar105 = *(undefined1 (*) [32])(lVar90 + 0x21fdb88 + lVar87 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar90 + 0x21fe00c + lVar87 * 4);
        pfVar6 = (float *)(lVar90 + 0x21fe490 + lVar87 * 4);
        fVar71 = *pfVar6;
        fVar207 = pfVar6[1];
        fVar214 = pfVar6[2];
        fVar215 = pfVar6[3];
        fVar216 = pfVar6[4];
        fVar217 = pfVar6[5];
        fVar218 = pfVar6[6];
        auVar143._0_4_ = fVar71 * auVar181._0_4_;
        auVar143._4_4_ = fVar207 * auVar181._4_4_;
        auVar143._8_4_ = fVar214 * auVar181._8_4_;
        auVar143._12_4_ = fVar215 * auVar181._12_4_;
        auVar143._16_4_ = fVar216 * auVar181._16_4_;
        auVar143._20_4_ = fVar217 * auVar181._20_4_;
        auVar143._28_36_ = auVar181._28_36_;
        auVar143._24_4_ = fVar218 * auVar181._24_4_;
        auVar181._0_4_ = fVar71 * auVar175._0_4_;
        auVar181._4_4_ = fVar207 * auVar175._4_4_;
        auVar181._8_4_ = fVar214 * auVar175._8_4_;
        auVar181._12_4_ = fVar215 * auVar175._12_4_;
        auVar181._16_4_ = fVar216 * auVar175._16_4_;
        auVar181._20_4_ = fVar217 * auVar175._20_4_;
        auVar181._28_36_ = auVar175._28_36_;
        auVar181._24_4_ = fVar218 * auVar175._24_4_;
        auVar16 = vfmadd231ps_fma(auVar143._0_32_,auVar123,auVar137);
        auVar17 = vfmadd231ps_fma(auVar181._0_32_,auVar123,auVar147._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar105,auVar213._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar105,auVar126._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar141,auVar210);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar141,local_460);
        local_520 = ZEXT1632(auVar14);
        auVar100 = vsubps_avx(ZEXT1632(auVar16),local_520);
        local_500 = ZEXT1632(auVar17);
        auVar140 = ZEXT1632(auVar15);
        auVar20 = vsubps_avx(local_500,auVar140);
        auVar106._4_4_ = auVar100._4_4_ * auVar15._4_4_;
        auVar106._0_4_ = auVar100._0_4_ * auVar15._0_4_;
        auVar106._8_4_ = auVar100._8_4_ * auVar15._8_4_;
        auVar106._12_4_ = auVar100._12_4_ * auVar15._12_4_;
        auVar106._16_4_ = auVar100._16_4_ * 0.0;
        auVar106._20_4_ = auVar100._20_4_ * 0.0;
        auVar106._24_4_ = auVar100._24_4_ * 0.0;
        auVar106._28_4_ = uVar195;
        fVar128 = auVar20._0_4_;
        auVar189._0_4_ = auVar14._0_4_ * fVar128;
        fVar127 = auVar20._4_4_;
        auVar189._4_4_ = auVar14._4_4_ * fVar127;
        fVar107 = auVar20._8_4_;
        auVar189._8_4_ = auVar14._8_4_ * fVar107;
        fVar108 = auVar20._12_4_;
        auVar189._12_4_ = auVar14._12_4_ * fVar108;
        fVar109 = auVar20._16_4_;
        auVar189._16_4_ = fVar109 * 0.0;
        fVar110 = auVar20._20_4_;
        auVar189._20_4_ = fVar110 * 0.0;
        fVar111 = auVar20._24_4_;
        auVar189._28_36_ = auVar126._28_36_;
        auVar189._24_4_ = fVar111 * 0.0;
        auVar202 = ZEXT3264(auVar98);
        auVar106 = vsubps_avx(auVar106,auVar189._0_32_);
        auVar172._0_4_ = fVar112 * (float)local_e0;
        auVar172._4_4_ = fVar198 * local_e0._4_4_;
        auVar172._8_4_ = fVar204 * (float)uStack_d8;
        auVar172._12_4_ = fVar67 * uStack_d8._4_4_;
        auVar172._16_4_ = fVar68 * (float)uStack_d0;
        auVar172._20_4_ = fVar69 * uStack_d0._4_4_;
        auVar172._24_4_ = fVar70 * (float)uStack_c8;
        auVar172._28_4_ = 0;
        auVar14 = vfmadd231ps_fma(auVar172,auVar98,local_c0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar170,local_a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,auVar155);
        auVar39._4_4_ = fVar207 * local_e0._4_4_;
        auVar39._0_4_ = fVar71 * (float)local_e0;
        auVar39._8_4_ = fVar214 * (float)uStack_d8;
        auVar39._12_4_ = fVar215 * uStack_d8._4_4_;
        auVar39._16_4_ = fVar216 * (float)uStack_d0;
        auVar39._20_4_ = fVar217 * uStack_d0._4_4_;
        auVar39._24_4_ = fVar218 * (float)uStack_c8;
        auVar39._28_4_ = uStack_c8._4_4_;
        auVar17 = vfmadd231ps_fma(auVar39,auVar123,local_c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar105,local_a0);
        auVar143 = ZEXT3264(auVar141);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar141,local_80);
        auVar40._4_4_ = fVar127 * fVar127;
        auVar40._0_4_ = fVar128 * fVar128;
        auVar40._8_4_ = fVar107 * fVar107;
        auVar40._12_4_ = fVar108 * fVar108;
        auVar40._16_4_ = fVar109 * fVar109;
        auVar40._20_4_ = fVar110 * fVar110;
        auVar40._24_4_ = fVar111 * fVar111;
        auVar40._28_4_ = local_80._28_4_;
        auVar18 = vfmadd231ps_fma(auVar40,auVar100,auVar100);
        _local_480 = ZEXT1632(auVar17);
        auVar162 = vmaxps_avx(ZEXT1632(auVar14),_local_480);
        auVar186._0_4_ = auVar162._0_4_ * auVar162._0_4_ * auVar18._0_4_;
        auVar186._4_4_ = auVar162._4_4_ * auVar162._4_4_ * auVar18._4_4_;
        auVar186._8_4_ = auVar162._8_4_ * auVar162._8_4_ * auVar18._8_4_;
        auVar186._12_4_ = auVar162._12_4_ * auVar162._12_4_ * auVar18._12_4_;
        auVar186._16_4_ = auVar162._16_4_ * auVar162._16_4_ * 0.0;
        auVar186._20_4_ = auVar162._20_4_ * auVar162._20_4_ * 0.0;
        auVar186._24_4_ = auVar162._24_4_ * auVar162._24_4_ * 0.0;
        auVar186._28_4_ = 0;
        auVar41._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar41._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar41._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar41._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar41._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar41._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar41._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar41._28_4_ = auVar106._28_4_;
        auVar162 = vcmpps_avx(auVar41,auVar186,2);
        local_200 = (int)lVar87;
        auVar187._4_4_ = local_200;
        auVar187._0_4_ = local_200;
        auVar187._8_4_ = local_200;
        auVar187._12_4_ = local_200;
        auVar187._16_4_ = local_200;
        auVar187._20_4_ = local_200;
        auVar187._24_4_ = local_200;
        auVar187._28_4_ = local_200;
        auVar106 = vpor_avx2(auVar187,_DAT_01fb4ba0);
        auVar21 = vpcmpgtd_avx2(local_300,auVar106);
        auVar106 = auVar21 & auVar162;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar189 = ZEXT3264(auVar185);
          auVar126 = ZEXT3264(local_6a0);
          auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
          auVar213 = ZEXT3264(local_700);
        }
        else {
          _local_440 = vandps_avx(auVar21,auVar162);
          auVar42._4_4_ = fVar207 * (float)local_540._4_4_;
          auVar42._0_4_ = fVar71 * (float)local_540._0_4_;
          auVar42._8_4_ = fVar214 * fStack_538;
          auVar42._12_4_ = fVar215 * fStack_534;
          auVar42._16_4_ = fVar216 * fStack_530;
          auVar42._20_4_ = fVar217 * fStack_52c;
          auVar42._24_4_ = fVar218 * fStack_528;
          auVar42._28_4_ = auVar162._28_4_;
          auVar17 = vfmadd213ps_fma(auVar123,local_280,auVar42);
          auVar17 = vfmadd213ps_fma(auVar105,local_600,ZEXT1632(auVar17));
          auVar17 = vfmadd132ps_fma(auVar141,ZEXT1632(auVar17),local_4e0);
          local_420._0_4_ = auVar81._0_4_;
          local_420._4_4_ = auVar81._4_4_;
          fStack_418 = auVar81._8_4_;
          fStack_414 = auVar81._12_4_;
          fStack_410 = auVar81._16_4_;
          fStack_40c = auVar81._20_4_;
          fStack_408 = auVar81._24_4_;
          auVar43._4_4_ = (float)local_540._4_4_ * (float)local_420._4_4_;
          auVar43._0_4_ = (float)local_540._0_4_ * (float)local_420._0_4_;
          auVar43._8_4_ = fStack_538 * fStack_418;
          auVar43._12_4_ = fStack_534 * fStack_414;
          auVar43._16_4_ = fStack_530 * fStack_410;
          auVar43._20_4_ = fStack_52c * fStack_40c;
          auVar43._24_4_ = fStack_528 * fStack_408;
          auVar43._28_4_ = auVar162._28_4_;
          auVar18 = vfmadd213ps_fma(auVar98,local_280,auVar43);
          auVar18 = vfmadd213ps_fma(auVar170,local_600,ZEXT1632(auVar18));
          auVar170 = *(undefined1 (*) [32])(lVar90 + 0x21fc4f4 + lVar87 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar90 + 0x21fc978 + lVar87 * 4);
          auVar141 = *(undefined1 (*) [32])(lVar90 + 0x21fcdfc + lVar87 * 4);
          pfVar6 = (float *)(lVar90 + 0x21fd280 + lVar87 * 4);
          fVar128 = *pfVar6;
          fVar127 = pfVar6[1];
          fVar107 = pfVar6[2];
          fVar108 = pfVar6[3];
          fVar109 = pfVar6[4];
          fVar110 = pfVar6[5];
          fVar111 = pfVar6[6];
          auVar44._4_4_ = fVar127 * fStack_63c;
          auVar44._0_4_ = fVar128 * local_640;
          auVar44._8_4_ = fVar107 * fStack_638;
          auVar44._12_4_ = fVar108 * fStack_634;
          auVar44._16_4_ = fVar109 * fStack_630;
          auVar44._20_4_ = fVar110 * fStack_62c;
          auVar44._24_4_ = fVar111 * fStack_628;
          auVar44._28_4_ = local_600._28_4_;
          auVar200._0_4_ = fVar128 * fVar205;
          auVar200._4_4_ = fVar127 * fVar206;
          auVar200._8_4_ = fVar107 * fVar205;
          auVar200._12_4_ = fVar108 * fVar206;
          auVar200._16_4_ = fVar109 * fVar205;
          auVar200._20_4_ = fVar110 * fVar206;
          auVar200._24_4_ = fVar111 * fVar205;
          auVar200._28_4_ = 0;
          auVar45._4_4_ = fVar127 * (float)local_540._4_4_;
          auVar45._0_4_ = fVar128 * (float)local_540._0_4_;
          auVar45._8_4_ = fVar107 * fStack_538;
          auVar45._12_4_ = fVar108 * fStack_534;
          auVar45._16_4_ = fVar109 * fStack_530;
          auVar45._20_4_ = fVar110 * fStack_52c;
          auVar45._24_4_ = fVar111 * fStack_528;
          auVar45._28_4_ = pfVar6[7];
          auVar19 = vfmadd231ps_fma(auVar44,auVar141,auVar137);
          auVar96 = vfmadd231ps_fma(auVar200,auVar141,local_620);
          auVar95 = vfmadd231ps_fma(auVar45,local_280,auVar141);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar98,local_700);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar98,local_6a0);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_600,auVar98);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar170,auVar210);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar170,local_460);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar170,local_4e0);
          pfVar6 = (float *)(lVar90 + 0x21ff6a0 + lVar87 * 4);
          fVar128 = *pfVar6;
          fVar127 = pfVar6[1];
          fVar107 = pfVar6[2];
          fVar108 = pfVar6[3];
          fVar109 = pfVar6[4];
          fVar110 = pfVar6[5];
          fVar111 = pfVar6[6];
          auVar46._4_4_ = fStack_63c * fVar127;
          auVar46._0_4_ = local_640 * fVar128;
          auVar46._8_4_ = fStack_638 * fVar107;
          auVar46._12_4_ = fStack_634 * fVar108;
          auVar46._16_4_ = fStack_630 * fVar109;
          auVar46._20_4_ = fStack_62c * fVar110;
          auVar46._24_4_ = fStack_628 * fVar111;
          auVar46._28_4_ = auVar100._28_4_;
          auVar47._4_4_ = fVar206 * fVar127;
          auVar47._0_4_ = fVar205 * fVar128;
          auVar47._8_4_ = fVar205 * fVar107;
          auVar47._12_4_ = fVar206 * fVar108;
          auVar47._16_4_ = fVar205 * fVar109;
          auVar47._20_4_ = fVar206 * fVar110;
          auVar47._24_4_ = fVar205 * fVar111;
          auVar47._28_4_ = auVar20._28_4_;
          auVar48._4_4_ = fVar127 * (float)local_540._4_4_;
          auVar48._0_4_ = fVar128 * (float)local_540._0_4_;
          auVar48._8_4_ = fVar107 * fStack_538;
          auVar48._12_4_ = fVar108 * fStack_534;
          auVar48._16_4_ = fVar109 * fStack_530;
          auVar48._20_4_ = fVar110 * fStack_52c;
          auVar48._24_4_ = fVar111 * fStack_528;
          auVar48._28_4_ = pfVar6[7];
          auVar170 = *(undefined1 (*) [32])(lVar90 + 0x21ff21c + lVar87 * 4);
          auVar129 = vfmadd231ps_fma(auVar46,auVar170,auVar137);
          auVar115 = vfmadd231ps_fma(auVar47,auVar170,local_620);
          auVar94 = vfmadd231ps_fma(auVar48,local_280,auVar170);
          auVar170 = *(undefined1 (*) [32])(lVar90 + 0x21fed98 + lVar87 * 4);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar170,local_700);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar170,local_6a0);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar170,local_600);
          auVar170 = *(undefined1 (*) [32])(lVar90 + 0x21fe914 + lVar87 * 4);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar170,auVar210);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar170,local_460);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_4e0,auVar170);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar188._16_4_ = 0x7fffffff;
          auVar188._20_4_ = 0x7fffffff;
          auVar188._24_4_ = 0x7fffffff;
          auVar188._28_4_ = 0x7fffffff;
          auVar170 = vandps_avx(ZEXT1632(auVar19),auVar188);
          auVar98 = vandps_avx(ZEXT1632(auVar96),auVar188);
          auVar98 = vmaxps_avx(auVar170,auVar98);
          auVar170 = vandps_avx(ZEXT1632(auVar95),auVar188);
          auVar170 = vmaxps_avx(auVar98,auVar170);
          auVar170 = vcmpps_avx(auVar170,_local_320,1);
          auVar141 = vblendvps_avx(ZEXT1632(auVar19),auVar100,auVar170);
          auVar105 = vblendvps_avx(ZEXT1632(auVar96),auVar20,auVar170);
          auVar170 = vandps_avx(ZEXT1632(auVar129),auVar188);
          auVar98 = vandps_avx(ZEXT1632(auVar115),auVar188);
          auVar98 = vmaxps_avx(auVar170,auVar98);
          auVar170 = vandps_avx(auVar188,ZEXT1632(auVar94));
          auVar170 = vmaxps_avx(auVar98,auVar170);
          auVar98 = vcmpps_avx(auVar170,_local_320,1);
          auVar170 = vblendvps_avx(ZEXT1632(auVar129),auVar100,auVar98);
          auVar98 = vblendvps_avx(ZEXT1632(auVar115),auVar20,auVar98);
          auVar18 = vfmadd213ps_fma(auVar155,local_4e0,ZEXT1632(auVar18));
          auVar19 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar105,auVar105);
          auVar155 = vrsqrtps_avx(ZEXT1632(auVar19));
          fVar128 = auVar155._0_4_;
          fVar127 = auVar155._4_4_;
          fVar107 = auVar155._8_4_;
          fVar108 = auVar155._12_4_;
          fVar109 = auVar155._16_4_;
          fVar110 = auVar155._20_4_;
          fVar111 = auVar155._24_4_;
          auVar49._4_4_ = fVar127 * fVar127 * fVar127 * auVar19._4_4_ * -0.5;
          auVar49._0_4_ = fVar128 * fVar128 * fVar128 * auVar19._0_4_ * -0.5;
          auVar49._8_4_ = fVar107 * fVar107 * fVar107 * auVar19._8_4_ * -0.5;
          auVar49._12_4_ = fVar108 * fVar108 * fVar108 * auVar19._12_4_ * -0.5;
          auVar49._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar49._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar49._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
          auVar49._28_4_ = 0;
          auVar212._8_4_ = 0x3fc00000;
          auVar212._0_8_ = 0x3fc000003fc00000;
          auVar212._12_4_ = 0x3fc00000;
          auVar212._16_4_ = 0x3fc00000;
          auVar212._20_4_ = 0x3fc00000;
          auVar212._24_4_ = 0x3fc00000;
          auVar212._28_4_ = 0x3fc00000;
          auVar19 = vfmadd231ps_fma(auVar49,auVar212,auVar155);
          fVar128 = auVar19._0_4_;
          fVar127 = auVar19._4_4_;
          auVar50._4_4_ = auVar105._4_4_ * fVar127;
          auVar50._0_4_ = auVar105._0_4_ * fVar128;
          fVar107 = auVar19._8_4_;
          auVar50._8_4_ = auVar105._8_4_ * fVar107;
          fVar108 = auVar19._12_4_;
          auVar50._12_4_ = auVar105._12_4_ * fVar108;
          auVar50._16_4_ = auVar105._16_4_ * 0.0;
          auVar50._20_4_ = auVar105._20_4_ * 0.0;
          auVar50._24_4_ = auVar105._24_4_ * 0.0;
          auVar50._28_4_ = auVar155._28_4_;
          auVar51._4_4_ = fVar127 * -auVar141._4_4_;
          auVar51._0_4_ = fVar128 * -auVar141._0_4_;
          auVar51._8_4_ = fVar107 * -auVar141._8_4_;
          auVar51._12_4_ = fVar108 * -auVar141._12_4_;
          auVar51._16_4_ = -auVar141._16_4_ * 0.0;
          auVar51._20_4_ = -auVar141._20_4_ * 0.0;
          auVar51._24_4_ = -auVar141._24_4_ * 0.0;
          auVar51._28_4_ = auVar105._28_4_;
          auVar19 = vfmadd213ps_fma(auVar170,auVar170,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar98,auVar98);
          auVar155 = vrsqrtps_avx(ZEXT1632(auVar19));
          auVar52._28_4_ = auVar100._28_4_;
          auVar52._0_28_ =
               ZEXT1628(CONCAT412(fVar108 * 0.0,
                                  CONCAT48(fVar107 * 0.0,CONCAT44(fVar127 * 0.0,fVar128 * 0.0))));
          fVar128 = auVar155._0_4_;
          fVar127 = auVar155._4_4_;
          fVar107 = auVar155._8_4_;
          fVar108 = auVar155._12_4_;
          fVar109 = auVar155._16_4_;
          fVar110 = auVar155._20_4_;
          fVar111 = auVar155._24_4_;
          auVar53._4_4_ = fVar127 * fVar127 * fVar127 * auVar19._4_4_ * -0.5;
          auVar53._0_4_ = fVar128 * fVar128 * fVar128 * auVar19._0_4_ * -0.5;
          auVar53._8_4_ = fVar107 * fVar107 * fVar107 * auVar19._8_4_ * -0.5;
          auVar53._12_4_ = fVar108 * fVar108 * fVar108 * auVar19._12_4_ * -0.5;
          auVar53._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar53._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar53._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
          auVar53._28_4_ = 0;
          auVar19 = vfmadd231ps_fma(auVar53,auVar212,auVar155);
          fVar128 = auVar19._0_4_;
          fVar127 = auVar19._4_4_;
          auVar54._4_4_ = auVar98._4_4_ * fVar127;
          auVar54._0_4_ = auVar98._0_4_ * fVar128;
          fVar107 = auVar19._8_4_;
          auVar54._8_4_ = auVar98._8_4_ * fVar107;
          fVar108 = auVar19._12_4_;
          auVar54._12_4_ = auVar98._12_4_ * fVar108;
          auVar54._16_4_ = auVar98._16_4_ * 0.0;
          auVar54._20_4_ = auVar98._20_4_ * 0.0;
          auVar54._24_4_ = auVar98._24_4_ * 0.0;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = fVar127 * -auVar170._4_4_;
          auVar55._0_4_ = fVar128 * -auVar170._0_4_;
          auVar55._8_4_ = fVar107 * -auVar170._8_4_;
          auVar55._12_4_ = fVar108 * -auVar170._12_4_;
          auVar55._16_4_ = -auVar170._16_4_ * 0.0;
          auVar55._20_4_ = -auVar170._20_4_ * 0.0;
          auVar55._24_4_ = -auVar170._24_4_ * 0.0;
          auVar55._28_4_ = auVar155._28_4_;
          auVar56._28_4_ = 0xbf000000;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(fVar108 * 0.0,
                                  CONCAT48(fVar107 * 0.0,CONCAT44(fVar127 * 0.0,fVar128 * 0.0))));
          auVar19 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar14),local_520);
          auVar155 = ZEXT1632(auVar14);
          auVar96 = vfmadd213ps_fma(auVar51,auVar155,auVar140);
          auVar95 = vfmadd213ps_fma(auVar52,auVar155,ZEXT1632(auVar18));
          auVar94 = vfnmadd213ps_fma(auVar50,auVar155,local_520);
          auVar129 = vfmadd213ps_fma(auVar54,_local_480,ZEXT1632(auVar16));
          auVar130 = vfnmadd213ps_fma(auVar51,auVar155,auVar140);
          auVar115 = vfmadd213ps_fma(auVar55,_local_480,local_500);
          auVar119 = ZEXT1632(auVar14);
          auVar14 = vfnmadd231ps_fma(ZEXT1632(auVar18),auVar119,auVar52);
          auVar18 = vfmadd213ps_fma(auVar56,_local_480,ZEXT1632(auVar17));
          auVar144 = vfnmadd213ps_fma(auVar54,_local_480,ZEXT1632(auVar16));
          auVar149 = vfnmadd213ps_fma(auVar55,_local_480,local_500);
          auVar93 = vfnmadd231ps_fma(ZEXT1632(auVar17),_local_480,auVar56);
          local_5a0 = ZEXT1632(auVar93);
          auVar155 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar130));
          auVar170 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar14));
          auVar173._0_4_ = auVar155._0_4_ * auVar14._0_4_;
          auVar173._4_4_ = auVar155._4_4_ * auVar14._4_4_;
          auVar173._8_4_ = auVar155._8_4_ * auVar14._8_4_;
          auVar173._12_4_ = auVar155._12_4_ * auVar14._12_4_;
          auVar173._16_4_ = auVar155._16_4_ * 0.0;
          auVar173._20_4_ = auVar155._20_4_ * 0.0;
          auVar173._24_4_ = auVar155._24_4_ * 0.0;
          auVar173._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar173,ZEXT1632(auVar130),auVar170);
          auVar57._4_4_ = auVar94._4_4_ * auVar170._4_4_;
          auVar57._0_4_ = auVar94._0_4_ * auVar170._0_4_;
          auVar57._8_4_ = auVar94._8_4_ * auVar170._8_4_;
          auVar57._12_4_ = auVar94._12_4_ * auVar170._12_4_;
          auVar57._16_4_ = auVar170._16_4_ * 0.0;
          auVar57._20_4_ = auVar170._20_4_ * 0.0;
          auVar57._24_4_ = auVar170._24_4_ * 0.0;
          auVar57._28_4_ = auVar170._28_4_;
          auVar162 = ZEXT1632(auVar94);
          auVar170 = vsubps_avx(ZEXT1632(auVar129),auVar162);
          auVar106 = ZEXT1632(auVar14);
          auVar14 = vfmsub231ps_fma(auVar57,auVar106,auVar170);
          auVar58._4_4_ = auVar130._4_4_ * auVar170._4_4_;
          auVar58._0_4_ = auVar130._0_4_ * auVar170._0_4_;
          auVar58._8_4_ = auVar130._8_4_ * auVar170._8_4_;
          auVar58._12_4_ = auVar130._12_4_ * auVar170._12_4_;
          auVar58._16_4_ = auVar170._16_4_ * 0.0;
          auVar58._20_4_ = auVar170._20_4_ * 0.0;
          auVar58._24_4_ = auVar170._24_4_ * 0.0;
          auVar58._28_4_ = auVar170._28_4_;
          auVar17 = vfmsub231ps_fma(auVar58,auVar162,auVar155);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar21 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
          auVar155 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar19),auVar21);
          auVar170 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar96),auVar21);
          auVar98 = vblendvps_avx(local_5a0,ZEXT1632(auVar95),auVar21);
          auVar141 = vblendvps_avx(auVar162,ZEXT1632(auVar129),auVar21);
          auVar105 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar115),auVar21);
          auVar123 = vblendvps_avx(auVar106,ZEXT1632(auVar18),auVar21);
          auVar162 = vblendvps_avx(ZEXT1632(auVar129),auVar162,auVar21);
          auVar100 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar130),auVar21);
          auVar14 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
          auVar106 = vblendvps_avx(ZEXT1632(auVar18),auVar106,auVar21);
          auVar162 = vsubps_avx(auVar162,auVar155);
          auVar100 = vsubps_avx(auVar100,auVar170);
          auVar140 = vsubps_avx(auVar106,auVar98);
          auVar202 = ZEXT3264(auVar140);
          auVar99 = vsubps_avx(auVar155,auVar141);
          auVar101 = vsubps_avx(auVar170,auVar105);
          auVar118 = vsubps_avx(auVar98,auVar123);
          auVar163._0_4_ = auVar140._0_4_ * auVar155._0_4_;
          auVar163._4_4_ = auVar140._4_4_ * auVar155._4_4_;
          auVar163._8_4_ = auVar140._8_4_ * auVar155._8_4_;
          auVar163._12_4_ = auVar140._12_4_ * auVar155._12_4_;
          auVar163._16_4_ = auVar140._16_4_ * auVar155._16_4_;
          auVar163._20_4_ = auVar140._20_4_ * auVar155._20_4_;
          auVar163._24_4_ = auVar140._24_4_ * auVar155._24_4_;
          auVar163._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar163,auVar98,auVar162);
          auVar59._4_4_ = auVar162._4_4_ * auVar170._4_4_;
          auVar59._0_4_ = auVar162._0_4_ * auVar170._0_4_;
          auVar59._8_4_ = auVar162._8_4_ * auVar170._8_4_;
          auVar59._12_4_ = auVar162._12_4_ * auVar170._12_4_;
          auVar59._16_4_ = auVar162._16_4_ * auVar170._16_4_;
          auVar59._20_4_ = auVar162._20_4_ * auVar170._20_4_;
          auVar59._24_4_ = auVar162._24_4_ * auVar170._24_4_;
          auVar59._28_4_ = auVar106._28_4_;
          auVar17 = vfmsub231ps_fma(auVar59,auVar155,auVar100);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar164._0_4_ = auVar100._0_4_ * auVar98._0_4_;
          auVar164._4_4_ = auVar100._4_4_ * auVar98._4_4_;
          auVar164._8_4_ = auVar100._8_4_ * auVar98._8_4_;
          auVar164._12_4_ = auVar100._12_4_ * auVar98._12_4_;
          auVar164._16_4_ = auVar100._16_4_ * auVar98._16_4_;
          auVar164._20_4_ = auVar100._20_4_ * auVar98._20_4_;
          auVar164._24_4_ = auVar100._24_4_ * auVar98._24_4_;
          auVar164._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar164,auVar170,auVar140);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar143 = ZEXT1664(auVar17);
          auVar165._0_4_ = auVar118._0_4_ * auVar141._0_4_;
          auVar165._4_4_ = auVar118._4_4_ * auVar141._4_4_;
          auVar165._8_4_ = auVar118._8_4_ * auVar141._8_4_;
          auVar165._12_4_ = auVar118._12_4_ * auVar141._12_4_;
          auVar165._16_4_ = auVar118._16_4_ * auVar141._16_4_;
          auVar165._20_4_ = auVar118._20_4_ * auVar141._20_4_;
          auVar165._24_4_ = auVar118._24_4_ * auVar141._24_4_;
          auVar165._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar165,auVar99,auVar123);
          auVar60._4_4_ = auVar101._4_4_ * auVar123._4_4_;
          auVar60._0_4_ = auVar101._0_4_ * auVar123._0_4_;
          auVar60._8_4_ = auVar101._8_4_ * auVar123._8_4_;
          auVar60._12_4_ = auVar101._12_4_ * auVar123._12_4_;
          auVar60._16_4_ = auVar101._16_4_ * auVar123._16_4_;
          auVar60._20_4_ = auVar101._20_4_ * auVar123._20_4_;
          auVar60._24_4_ = auVar101._24_4_ * auVar123._24_4_;
          auVar60._28_4_ = auVar123._28_4_;
          auVar18 = vfmsub231ps_fma(auVar60,auVar105,auVar118);
          auVar61._4_4_ = auVar99._4_4_ * auVar105._4_4_;
          auVar61._0_4_ = auVar99._0_4_ * auVar105._0_4_;
          auVar61._8_4_ = auVar99._8_4_ * auVar105._8_4_;
          auVar61._12_4_ = auVar99._12_4_ * auVar105._12_4_;
          auVar61._16_4_ = auVar99._16_4_ * auVar105._16_4_;
          auVar61._20_4_ = auVar99._20_4_ * auVar105._20_4_;
          auVar61._24_4_ = auVar99._24_4_ * auVar105._24_4_;
          auVar61._28_4_ = auVar105._28_4_;
          auVar19 = vfmsub231ps_fma(auVar61,auVar101,auVar141);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar141 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
          auVar141 = vcmpps_avx(auVar141,ZEXT832(0) << 0x20,2);
          auVar16 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
          auVar14 = vpand_avx(auVar16,auVar14);
          auVar141 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar141 >> 0x7f,0) == '\0') &&
                (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0xbf,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar141[0x1f]) {
LAB_011a5d4a:
            auVar146._8_8_ = uStack_498;
            auVar146._0_8_ = local_4a0;
            auVar146._16_8_ = uStack_490;
            auVar146._24_8_ = uStack_488;
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar189 = ZEXT3264(auVar185);
          }
          else {
            auVar62._4_4_ = auVar100._4_4_ * auVar118._4_4_;
            auVar62._0_4_ = auVar100._0_4_ * auVar118._0_4_;
            auVar62._8_4_ = auVar100._8_4_ * auVar118._8_4_;
            auVar62._12_4_ = auVar100._12_4_ * auVar118._12_4_;
            auVar62._16_4_ = auVar100._16_4_ * auVar118._16_4_;
            auVar62._20_4_ = auVar100._20_4_ * auVar118._20_4_;
            auVar62._24_4_ = auVar100._24_4_ * auVar118._24_4_;
            auVar62._28_4_ = auVar141._28_4_;
            auVar95 = vfmsub231ps_fma(auVar62,auVar101,auVar140);
            auVar174._0_4_ = auVar140._0_4_ * auVar99._0_4_;
            auVar174._4_4_ = auVar140._4_4_ * auVar99._4_4_;
            auVar174._8_4_ = auVar140._8_4_ * auVar99._8_4_;
            auVar174._12_4_ = auVar140._12_4_ * auVar99._12_4_;
            auVar174._16_4_ = auVar140._16_4_ * auVar99._16_4_;
            auVar174._20_4_ = auVar140._20_4_ * auVar99._20_4_;
            auVar174._24_4_ = auVar140._24_4_ * auVar99._24_4_;
            auVar174._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar174,auVar162,auVar118);
            auVar63._4_4_ = auVar162._4_4_ * auVar101._4_4_;
            auVar63._0_4_ = auVar162._0_4_ * auVar101._0_4_;
            auVar63._8_4_ = auVar162._8_4_ * auVar101._8_4_;
            auVar63._12_4_ = auVar162._12_4_ * auVar101._12_4_;
            auVar63._16_4_ = auVar162._16_4_ * auVar101._16_4_;
            auVar63._20_4_ = auVar162._20_4_ * auVar101._20_4_;
            auVar63._24_4_ = auVar162._24_4_ * auVar101._24_4_;
            auVar63._28_4_ = auVar101._28_4_;
            auVar129 = vfmsub231ps_fma(auVar63,auVar99,auVar100);
            auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar129));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar95),ZEXT832(0) << 0x20);
            auVar141 = vrcpps_avx(ZEXT1632(auVar19));
            auVar201._8_4_ = 0x3f800000;
            auVar201._0_8_ = 0x3f8000003f800000;
            auVar201._12_4_ = 0x3f800000;
            auVar201._16_4_ = 0x3f800000;
            auVar201._20_4_ = 0x3f800000;
            auVar201._24_4_ = 0x3f800000;
            auVar201._28_4_ = 0x3f800000;
            auVar202 = ZEXT3264(auVar201);
            auVar16 = vfnmadd213ps_fma(auVar141,ZEXT1632(auVar19),auVar201);
            auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar141,auVar141);
            auVar64._4_4_ = auVar129._4_4_ * auVar98._4_4_;
            auVar64._0_4_ = auVar129._0_4_ * auVar98._0_4_;
            auVar64._8_4_ = auVar129._8_4_ * auVar98._8_4_;
            auVar64._12_4_ = auVar129._12_4_ * auVar98._12_4_;
            auVar64._16_4_ = auVar98._16_4_ * 0.0;
            auVar64._20_4_ = auVar98._20_4_ * 0.0;
            auVar64._24_4_ = auVar98._24_4_ * 0.0;
            auVar64._28_4_ = auVar98._28_4_;
            auVar96 = vfmadd231ps_fma(auVar64,auVar170,ZEXT1632(auVar96));
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar155,ZEXT1632(auVar95));
            fVar128 = auVar16._0_4_;
            fVar127 = auVar16._4_4_;
            fVar107 = auVar16._8_4_;
            fVar108 = auVar16._12_4_;
            auVar98 = ZEXT1632(CONCAT412(fVar108 * auVar96._12_4_,
                                         CONCAT48(fVar107 * auVar96._8_4_,
                                                  CONCAT44(fVar127 * auVar96._4_4_,
                                                           fVar128 * auVar96._0_4_))));
            uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar145._4_4_ = uVar89;
            auVar145._0_4_ = uVar89;
            auVar145._8_4_ = uVar89;
            auVar145._12_4_ = uVar89;
            auVar145._16_4_ = uVar89;
            auVar145._20_4_ = uVar89;
            auVar145._24_4_ = uVar89;
            auVar145._28_4_ = uVar89;
            auVar80._4_4_ = uStack_fc;
            auVar80._0_4_ = local_100;
            auVar80._8_4_ = uStack_f8;
            auVar80._12_4_ = uStack_f4;
            auVar80._16_4_ = uStack_f0;
            auVar80._20_4_ = uStack_ec;
            auVar80._24_4_ = uStack_e8;
            auVar80._28_4_ = uStack_e4;
            auVar155 = vcmpps_avx(auVar80,auVar98,2);
            auVar170 = vcmpps_avx(auVar98,auVar145,2);
            auVar155 = vandps_avx(auVar170,auVar155);
            auVar16 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
            auVar14 = vpand_avx(auVar14,auVar16);
            auVar155 = vpmovsxwd_avx2(auVar14);
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar155 >> 0x7f,0) == '\0') &&
                  (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar155 >> 0xbf,0) == '\0') &&
                (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar155[0x1f]) goto LAB_011a5d4a;
            auVar155 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
            auVar16 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
            auVar14 = vpand_avx(auVar14,auVar16);
            auVar155 = vpmovsxwd_avx2(auVar14);
            auVar146._8_8_ = uStack_498;
            auVar146._0_8_ = local_4a0;
            auVar146._16_8_ = uStack_490;
            auVar146._24_8_ = uStack_488;
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar189 = ZEXT3264(auVar185);
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0x7f,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0xbf,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar155[0x1f] < '\0') {
              auVar141 = ZEXT1632(CONCAT412(fVar108 * auVar17._12_4_,
                                            CONCAT48(fVar107 * auVar17._8_4_,
                                                     CONCAT44(fVar127 * auVar17._4_4_,
                                                              fVar128 * auVar17._0_4_))));
              auVar65._28_4_ = SUB84(uStack_488,4);
              auVar65._0_28_ =
                   ZEXT1628(CONCAT412(fVar108 * auVar18._12_4_,
                                      CONCAT48(fVar107 * auVar18._8_4_,
                                               CONCAT44(fVar127 * auVar18._4_4_,
                                                        fVar128 * auVar18._0_4_))));
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = 0x3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar182._16_4_ = 0x3f800000;
              auVar182._20_4_ = 0x3f800000;
              auVar182._24_4_ = 0x3f800000;
              auVar182._28_4_ = 0x3f800000;
              auVar170 = vsubps_avx(auVar182,auVar141);
              auVar170 = vblendvps_avx(auVar170,auVar141,auVar21);
              auVar197 = ZEXT3264(auVar170);
              auVar170 = vsubps_avx(auVar182,auVar65);
              local_360 = vblendvps_avx(auVar170,auVar65,auVar21);
              auVar143 = ZEXT3264(local_360);
              auVar189 = ZEXT3264(auVar98);
              auVar146 = auVar155;
            }
          }
          auVar213 = ZEXT3264(local_700);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0x7f,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0xbf,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar146[0x1f]) {
            auVar126 = ZEXT3264(local_6a0);
            auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                          CONCAT424(fStack_628,
                                                    CONCAT420(fStack_62c,
                                                              CONCAT416(fStack_630,
                                                                        CONCAT412(fStack_634,
                                                                                  CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
            auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
          }
          else {
            auVar155 = vsubps_avx(_local_480,auVar119);
            local_6c0 = auVar197._0_32_;
            auVar14 = vfmadd213ps_fma(auVar155,local_6c0,auVar119);
            fVar128 = *(float *)((long)local_5d8->ray_space + k * 4 + -0x10);
            auVar66._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar128;
            auVar66._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar128;
            auVar66._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar128;
            auVar66._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar128;
            auVar66._16_4_ = fVar128 * 0.0;
            auVar66._20_4_ = fVar128 * 0.0;
            auVar66._24_4_ = fVar128 * 0.0;
            auVar66._28_4_ = fVar128;
            local_720 = auVar189._0_32_;
            auVar155 = vcmpps_avx(local_720,auVar66,6);
            auVar170 = auVar146 & auVar155;
            auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                          CONCAT424(fStack_628,
                                                    CONCAT420(fStack_62c,
                                                              CONCAT416(fStack_630,
                                                                        CONCAT412(fStack_634,
                                                                                  CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
            auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,CONCAT416(
                                                  fVar205,CONCAT412(fVar206,CONCAT48(fVar205,uVar92)
                                                                   ))))));
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0x7f,0) == '\0') &&
                  (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar170 >> 0xbf,0) == '\0') &&
                (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar170[0x1f]) {
              auVar126 = ZEXT3264(local_6a0);
            }
            else {
              auVar125._8_4_ = 0xbf800000;
              auVar125._0_8_ = 0xbf800000bf800000;
              auVar125._12_4_ = 0xbf800000;
              auVar125._16_4_ = 0xbf800000;
              auVar125._20_4_ = 0xbf800000;
              auVar125._24_4_ = 0xbf800000;
              auVar125._28_4_ = 0xbf800000;
              auVar142._8_4_ = 0x40000000;
              auVar142._0_8_ = 0x4000000040000000;
              auVar142._12_4_ = 0x40000000;
              auVar142._16_4_ = 0x40000000;
              auVar142._20_4_ = 0x40000000;
              auVar142._24_4_ = 0x40000000;
              auVar142._28_4_ = 0x40000000;
              auVar143 = ZEXT3264(auVar142);
              auVar14 = vfmadd213ps_fma(local_360,auVar142,auVar125);
              local_240 = ZEXT1632(auVar14);
              local_1f0 = local_650;
              uStack_1e8 = uStack_648;
              local_1e0 = local_660;
              uStack_1d8 = uStack_658;
              local_1d0 = local_670;
              uStack_1c8 = uStack_668;
              pGVar12 = (context->scene->geometries).items[local_728].ptr;
              local_360 = local_240;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar85 = (RTCIntersectArguments *)0x0;
                auVar126 = ZEXT3264(local_6a0);
              }
              else {
                pRVar85 = context->args;
                auVar126 = ZEXT3264(local_6a0);
                if ((pRVar85->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar85 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar85 >> 8),1),
                   pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_5a0 = ZEXT1632(CONCAT88(auVar93._8_8_,pGVar12));
                  local_6e0 = ZEXT1632(CONCAT124(auVar15._4_12_,(int)uVar88));
                  auVar155 = vandps_avx(auVar155,auVar146);
                  fVar128 = (float)local_200;
                  auVar143 = ZEXT3264(CONCAT428(fVar128,CONCAT424(fVar128,CONCAT420(fVar128,
                                                  CONCAT416(fVar128,CONCAT412(fVar128,CONCAT48(
                                                  fVar128,CONCAT44(fVar128,fVar128))))))));
                  local_180[0] = (fVar128 + auVar197._0_4_ + 0.0) * local_120;
                  local_180[1] = (fVar128 + auVar197._4_4_ + 1.0) * fStack_11c;
                  local_180[2] = (fVar128 + auVar197._8_4_ + 2.0) * fStack_118;
                  local_180[3] = (fVar128 + auVar197._12_4_ + 3.0) * fStack_114;
                  fStack_170 = (fVar128 + auVar197._16_4_ + 4.0) * fStack_110;
                  fStack_16c = (fVar128 + auVar197._20_4_ + 5.0) * fStack_10c;
                  fStack_168 = (fVar128 + auVar197._24_4_ + 6.0) * fStack_108;
                  fStack_164 = fVar128 + auVar197._28_4_ + 7.0;
                  local_360._0_8_ = auVar14._0_8_;
                  local_360._8_8_ = auVar14._8_8_;
                  local_160 = local_360._0_8_;
                  uStack_158 = local_360._8_8_;
                  uStack_150 = 0;
                  uStack_148 = 0;
                  local_140 = local_720;
                  uVar89 = vmovmskps_avx(auVar155);
                  uVar88 = 0;
                  uVar86 = CONCAT44((int)((ulong)pRVar85 >> 0x20),uVar89);
                  for (uVar84 = uVar86; _local_420 = auVar20, local_260 = local_6c0,
                      local_220 = local_720, local_1fc = iVar11, (uVar84 & 1) == 0;
                      uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                    uVar88 = uVar88 + 1;
                  }
                  while (uVar86 != 0) {
                    uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3c0 = local_180[uVar88];
                    local_3b0 = *(undefined4 *)((long)&local_160 + uVar88 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar88 * 4);
                    fVar107 = 1.0 - local_3c0;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107)),
                                              ZEXT416((uint)(local_3c0 * fVar107)),
                                              ZEXT416(0xc0000000));
                    auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar107)),
                                              ZEXT416((uint)(local_3c0 * local_3c0)),
                                              ZEXT416(0x40000000));
                    fVar128 = auVar14._0_4_ * 3.0;
                    fVar127 = local_3c0 * local_3c0 * 3.0;
                    auVar160._0_4_ = fVar127 * local_550;
                    auVar160._4_4_ = fVar127 * fStack_54c;
                    auVar160._8_4_ = fVar127 * fStack_548;
                    auVar160._12_4_ = fVar127 * fStack_544;
                    auVar134._4_4_ = fVar128;
                    auVar134._0_4_ = fVar128;
                    auVar134._8_4_ = fVar128;
                    auVar134._12_4_ = fVar128;
                    auVar73._8_8_ = uStack_668;
                    auVar73._0_8_ = local_670;
                    auVar14 = vfmadd132ps_fma(auVar134,auVar160,auVar73);
                    fVar128 = auVar15._0_4_ * 3.0;
                    auVar152._4_4_ = fVar128;
                    auVar152._0_4_ = fVar128;
                    auVar152._8_4_ = fVar128;
                    auVar152._12_4_ = fVar128;
                    auVar75._8_8_ = uStack_658;
                    auVar75._0_8_ = local_660;
                    auVar14 = vfmadd132ps_fma(auVar152,auVar14,auVar75);
                    fVar128 = fVar107 * fVar107 * -3.0;
                    local_5d0.context = context->user;
                    auVar135._4_4_ = fVar128;
                    auVar135._0_4_ = fVar128;
                    auVar135._8_4_ = fVar128;
                    auVar135._12_4_ = fVar128;
                    auVar77._8_8_ = uStack_648;
                    auVar77._0_8_ = local_650;
                    auVar14 = vfmadd132ps_fma(auVar135,auVar14,auVar77);
                    local_3f0 = auVar14._0_4_;
                    local_3e0 = vshufps_avx(auVar14,auVar14,0x55);
                    local_3d0 = vshufps_avx(auVar14,auVar14,0xaa);
                    auVar143 = ZEXT1664(local_3d0);
                    local_3a0 = local_570._0_8_;
                    uStack_398 = local_570._8_8_;
                    local_390 = _local_560;
                    vpcmpeqd_avx2(ZEXT1632(_local_560),ZEXT1632(_local_560));
                    uStack_37c = (local_5d0.context)->instID[0];
                    local_380 = uStack_37c;
                    uStack_378 = uStack_37c;
                    uStack_374 = uStack_37c;
                    uStack_370 = (local_5d0.context)->instPrimID[0];
                    uStack_36c = uStack_370;
                    uStack_368 = uStack_370;
                    uStack_364 = uStack_370;
                    local_740 = *local_5e0;
                    local_5d0.valid = (int *)local_740;
                    local_5d0.geometryUserPtr = *(void **)(local_5a0._0_8_ + 0x18);
                    local_5d0.hit = (RTCHitN *)&local_3f0;
                    local_5d0.N = 4;
                    local_5d0.ray = (RTCRayN *)ray;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    fStack_3bc = local_3c0;
                    fStack_3b8 = local_3c0;
                    fStack_3b4 = local_3c0;
                    uStack_3ac = local_3b0;
                    uStack_3a8 = local_3b0;
                    uStack_3a4 = local_3b0;
                    if (*(code **)(local_5a0._0_8_ + 0x48) != (code *)0x0) {
                      auVar143 = ZEXT1664(local_3d0);
                      auVar202 = ZEXT1664(auVar202._0_16_);
                      (**(code **)(local_5a0._0_8_ + 0x48))(&local_5d0);
                    }
                    if (local_740 == (undefined1  [16])0x0) {
                      auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar14 = auVar14 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar202 = ZEXT1664(auVar202._0_16_);
                        (*p_Var13)(&local_5d0);
                      }
                      auVar15 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                      auVar14 = auVar15 ^ _DAT_01f46b70;
                      auVar136._8_4_ = 0xff800000;
                      auVar136._0_8_ = 0xff800000ff800000;
                      auVar136._12_4_ = 0xff800000;
                      auVar143 = ZEXT1664(auVar136);
                      auVar15 = vblendvps_avx(auVar136,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                              auVar15);
                      *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar15;
                    }
                    auVar117._8_8_ = 0x100000001;
                    auVar117._0_8_ = 0x100000001;
                    if ((auVar117 & auVar14) != (undefined1  [16])0x0) {
                      pRVar85 = (RTCIntersectArguments *)0x1;
                      goto LAB_011a5d91;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar89;
                    uVar84 = uVar88 & 0x3f;
                    uVar88 = 0;
                    uVar86 = uVar86 ^ 1L << uVar84;
                    for (uVar84 = uVar86; (uVar84 & 1) == 0;
                        uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                      uVar88 = uVar88 + 1;
                    }
                  }
                  pRVar85 = (RTCIntersectArguments *)0x0;
LAB_011a5d91:
                  auVar197 = ZEXT3264(local_6c0);
                  auVar189 = ZEXT3264(local_720);
                  auVar126 = ZEXT3264(local_6a0);
                  auVar181 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar175 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar205,CONCAT420(fVar206,
                                                  CONCAT416(fVar205,CONCAT412(fVar206,CONCAT48(
                                                  fVar205,uVar92)))))));
                  auVar213 = ZEXT3264(local_700);
                  uVar88 = (ulong)(uint)local_6e0._0_4_;
                }
              }
              uVar88 = CONCAT71((int7)(uVar88 >> 8),(byte)uVar88 | (byte)pRVar85);
            }
          }
        }
        auVar147 = ZEXT3264(local_620);
      }
    }
    if ((uVar88 & 1) != 0) break;
    uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar97._4_4_ = uVar89;
    auVar97._0_4_ = uVar89;
    auVar97._8_4_ = uVar89;
    auVar97._12_4_ = uVar89;
    auVar14 = vcmpps_avx(local_2e0,auVar97,2);
    uVar83 = vmovmskps_avx(auVar14);
    local_4a8 = (ulong)((uint)uVar91 & uVar83);
  }
  return local_4a8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }